

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O3

void __thiscall miniminer_tests::miniminer_1p1c::test_method(miniminer_1p1c *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  CTxMemPool *this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  CTxMemPoolEntry *pCVar4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  uint256 *puVar12;
  base_blob<256U> *pbVar13;
  pointer pCVar14;
  pointer psVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar19;
  CTransaction *pCVar20;
  CTxMemPoolEntry **ppCVar21;
  int64_t iVar22;
  _Rb_tree_node_base *p_Var23;
  _Base_ptr p_Var24;
  iterator iVar25;
  iterator iVar26;
  CAmount CVar27;
  iterator iVar28;
  mapped_type *pmVar29;
  shared_ptr<const_CTransaction> *tx;
  long lVar30;
  pointer psVar31;
  _Link_type __x;
  char *pcVar32;
  iterator pvVar33;
  allocator_type *__a;
  iterator in_R9;
  iterator pvVar34;
  MiniMiner *__args_4;
  key_type *__k;
  pointer target_feerate;
  pointer pCVar35;
  _Rb_tree_node_base *__s1;
  _Base_ptr p_Var36;
  pointer pCVar37;
  uchar *puVar38;
  pointer pCVar39;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<COutPoint> __l_05;
  initializer_list<COutPoint> __l_06;
  initializer_list<COutPoint> __l_07;
  const_string file;
  initializer_list<COutPoint> __l_08;
  const_string file_00;
  initializer_list<COutPoint> __l_09;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_10;
  initializer_list<CFeeRate> __l_11;
  initializer_list<COutPoint> __l_12;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  initializer_list<transaction_identifier<false>_> __l_13;
  initializer_list<transaction_identifier<false>_> __l_14;
  initializer_list<transaction_identifier<false>_> __l_15;
  initializer_list<transaction_identifier<false>_> __l_16;
  initializer_list<transaction_identifier<false>_> __l_17;
  initializer_list<transaction_identifier<false>_> __l_18;
  initializer_list<transaction_identifier<false>_> __l_19;
  initializer_list<transaction_identifier<false>_> __l_20;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  Span<unsigned_char> bytes;
  Span<unsigned_char> bytes_00;
  check_type cVar40;
  CFeeRate *local_d28;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  ulong local_b78;
  undefined1 *local_b70;
  undefined1 *local_b68;
  char *local_b60;
  char *local_b58;
  undefined1 *local_b50;
  undefined1 *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  char *local_b20;
  char *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  undefined1 *local_af0;
  undefined1 *local_ae8;
  char *local_ae0;
  char *local_ad8;
  int32_t tx6_vsize;
  undefined4 uStack_acc;
  element_type *local_ac8;
  shared_count sStack_ac0;
  _Base_ptr local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  undefined1 *local_a30;
  undefined1 *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  undefined1 *local_a00;
  undefined1 *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  long it4_spent;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  CAmount bumpfee4;
  CFeeRate tx4_feerate;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  vector<COutPoint,_std::allocator<COutPoint>_> nonexistent_outpoints;
  vector<CFeeRate,_std::allocator<CFeeRate>_> various_normal_feerates;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  all_transactions;
  vector<COutPoint,_std::allocator<COutPoint>_> all_parent_outputs;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  vector<COutPoint,_std::allocator<COutPoint>_> all_spent_outpoints;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  vector<COutPoint,_std::allocator<COutPoint>_> all_unspent_outpoints;
  CTransactionRef tx7;
  CTransactionRef tx6;
  CAmount tx5_mod_fee;
  CAmount tx5_delta;
  CTransactionRef tx5;
  CTransactionRef tx4;
  CTransactionRef tx3;
  CTransactionRef tx2;
  CTransactionRef tx1;
  CTransactionRef tx0;
  TestMemPoolEntryHelper entry;
  int32_t tx5_vsize;
  undefined4 uStack_4d4;
  element_type *local_4d0;
  shared_count sStack_4c8;
  _Base_ptr local_4c0;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> miniminer_info;
  CAmount bumpfee2;
  CFeeRate tx2_feerate;
  CAmount bumpfee0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_480;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  int32_t tx4_vsize;
  undefined4 uStack_454;
  element_type *peStack_450;
  shared_count sStack_448;
  CFeeRate *local_440;
  uint32_t local_438;
  uint256 hash_1;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_3f8;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees_all_parents;
  MiniMiner miniminer_pool;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  descendant_caches;
  MiniMiner miniminer_manual;
  map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
  tx_dims;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar32 = "m_node.mempool";
  puVar19 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                       ,0x6f,"test_method","m_node.mempool");
  this_00 = (puVar19->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_00->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  peVar3 = (((this->super_TestChain100Setup).m_coinbase_txns.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar38 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar38[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar38[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar38[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar38[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar38[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar38[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar38[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar38[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l,
             (allocator_type *)&hash_1);
  make_tx((miniminer_tests *)&tx0,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx0);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
  pbVar13 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_00,
             (allocator_type *)&hash_1);
  make_tx((miniminer_tests *)&tx1,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,1
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx1);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar38 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar38[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar38[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar38[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar38[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar38[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar38[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar38[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar38[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_01,
             (allocator_type *)&hash_1);
  make_tx((miniminer_tests *)&tx2,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar12 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
  pbVar13 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_02,
             (allocator_type *)&hash_1);
  make_tx((miniminer_tests *)&tx3,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,1
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx3);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar38 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar38[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar38[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar38[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar38[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar38[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar38[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar38[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar38[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_03,
             (allocator_type *)&hash_1);
  make_tx((miniminer_tests *)&tx4,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx4);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar12 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
  pbVar13 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_04,
             (allocator_type *)&hash_1);
  make_tx((miniminer_tests *)&tx5,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,1
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  tx5_delta = 10000;
  CTxMemPool::PrioritiseTransaction
            (this_00,&((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped,&tx5_delta);
  tx5_mod_fee = 0x2904;
  peVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  puVar38 = (uchar *)((long)&peVar3->hash + 8);
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = puVar38[0];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = puVar38[1];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = puVar38[2];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = puVar38[3];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = puVar38[4];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = puVar38[5];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = puVar38[6];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = puVar38[7];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_05,
             (allocator_type *)&hash_1);
  make_tx((miniminer_tests *)&tx6,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,2
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx6);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar12 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
  pbVar13 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,__l_06,
             (allocator_type *)&hash_1);
  make_tx((miniminer_tests *)&tx7,(vector<COutPoint,_std::allocator<COutPoint>_> *)&miniminer_pool,1
         );
  if (miniminer_pool._0_8_ != 0) {
    operator_delete((void *)miniminer_pool._0_8_,
                    miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                    _0_8_ - miniminer_pool._0_8_);
  }
  entry.nFee = 500;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&miniminer_manual,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&miniminer_manual);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header)
  ;
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
  if (miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_);
  }
  puVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
  pbVar13 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  uVar6 = *(undefined8 *)
           ((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar9 = *(undefined8 *)
           (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar8 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar9,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar9 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 0;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 1;
  uVar6 = *(undefined8 *)
           ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ = SUB84(uVar6,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       SUB84(uVar7,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       (undefined4)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0
  ;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar13 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_bump_fees._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_bump_fees._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_bump_fees._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_bump_fees._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_bump_fees._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_bump_fees._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_bump_fees._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_bump_fees._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 1;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        ((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._28_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual._196_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_total_fees._0_4_ = 1;
  miniminer_manual._252_8_ =
       *(undefined8 *)
        ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar13 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual._260_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual._261_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual._262_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual._263_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       0;
  __l_07._M_len = 8;
  __l_07._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (&all_unspent_outpoints,__l_07,(allocator_type *)&miniminer_pool);
  pCVar14 = all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar37 = all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_5d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_5c8 = "";
      local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x9a;
      file.m_begin = (iterator)&local_5d0;
      msg.m_end = in_R9;
      msg.m_begin = pcVar32;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_5e0,msg)
      ;
      _cVar40 = 0x44ae12;
      bVar16 = CTxMemPool::isSpent(this_00,pCVar37);
      miniminer_pool.m_ready_to_calculate = !bVar16;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ = 0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
      ;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_cfceee;
      hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"!pool.isSpent(outpoint)" + 0x17;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
      miniminer_manual._0_8_ = &PTR__lazy_ostream_013ae1c8;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&hash_1;
      local_5f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_5e8 = "";
      pcVar32 = (char *)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
                 _cVar40,(size_t)&local_5f0,0x9a);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
                );
      pCVar37 = pCVar37 + 1;
    } while (pCVar37 != pCVar14);
  }
  puVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
  pbVar13 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  uVar6 = *(undefined8 *)
           ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar9 = *(undefined8 *)
           (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar8 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar9,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar9 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 0;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 0;
  uVar6 = *(undefined8 *)
           ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ = SUB84(uVar6,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       SUB84(uVar7,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       (undefined4)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0
  ;
  __l_08._M_len = 4;
  __l_08._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (&all_spent_outpoints,__l_08,(allocator_type *)&miniminer_pool);
  pCVar14 = all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar37 = all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_618 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_610 = "";
      local_628 = &boost::unit_test::basic_cstring<char_const>::null;
      local_620 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xa2;
      file_00.m_begin = (iterator)&local_618;
      msg_00.m_end = in_R9;
      msg_00.m_begin = pcVar32;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_628,
                 msg_00);
      _cVar40 = 0x44aff9;
      pCVar20 = CTxMemPool::GetConflictTx(this_00,pCVar37);
      miniminer_pool.m_ready_to_calculate = pCVar20 != (CTransaction *)0x0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ = 0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
      ;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_cfcf04;
      hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
           (long)"pool.GetConflictTx(outpoint) != nullptr" + 0x27;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
      miniminer_manual._0_8_ = &PTR__lazy_ostream_013ae1c8;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           boost::unit_test::lazy_ostream::inst;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&hash_1;
      local_638 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_630 = "";
      pcVar32 = (char *)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
                 _cVar40,(size_t)&local_638,0xa2);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header
                );
      pCVar37 = pCVar37 + 1;
    } while (pCVar37 != pCVar14);
  }
  puVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped;
  miniminer_manual.m_ready_to_calculate = (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
  miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
  miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
  miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
  miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
  miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
  miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
  miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
  pbVar13 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  uVar6 = *(undefined8 *)
           ((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar9 = *(undefined8 *)
           (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)uVar6;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       (undefined4)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)uVar7;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84((ulong)uVar8 >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = SUB84(uVar9,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)((ulong)uVar9 >> 0x20);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = 1;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = *(_Base_ptr *)
               ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = *(_Base_ptr *)
             (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
              ).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = *(_Base_ptr *)
              (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ = 0;
  uVar6 = *(undefined8 *)
           ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
           m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)
           (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
            m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ = SUB84(uVar6,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)((ulong)uVar6 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       SUB84(uVar7,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       (undefined4)((ulong)uVar7 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       (undefined4)uVar8;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       (undefined4)((ulong)uVar8 >> 0x20);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 1
  ;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar13 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual.m_bump_fees._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual.m_bump_fees._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual.m_bump_fees._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual.m_bump_fees._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_bump_fees._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_bump_fees._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_bump_fees._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_bump_fees._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._M_header._20_8_ =
       *(undefined8 *)
        ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_bump_fees._M_t._M_impl.super__Rb_tree_header._28_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual._196_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_in_block._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_total_fees._0_4_ = 0;
  miniminer_manual._252_8_ =
       *(undefined8 *)
        ((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
        m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pbVar13 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>;
  miniminer_manual._260_1_ = (pbVar13->m_data)._M_elems[8];
  miniminer_manual._261_1_ = (pbVar13->m_data)._M_elems[9];
  miniminer_manual._262_1_ = (pbVar13->m_data)._M_elems[10];
  miniminer_manual._263_1_ = (pbVar13->m_data)._M_elems[0xb];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[0xc];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[0xd];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[0xe];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xf];
  miniminer_manual.m_entries_by_txid._M_t._M_impl._4_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_8_ =
       *(undefined8 *)
        (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  miniminer_manual.m_entries_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       1;
  __l_09._M_len = 8;
  __l_09._M_array = (iterator)&miniminer_manual;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            (&all_parent_outputs,__l_09,(allocator_type *)&miniminer_pool);
  miniminer_manual._0_8_ =
       tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
       tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
       SUB84(tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
       (undefined4)
       ((ulong)tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr >> 0x20
       );
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
       SUB84(tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,0);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
       (undefined4)
       ((ulong)tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi >> 0x20);
  if (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       SUB84(tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (undefined4)
       ((ulong)tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr >> 0x20
       );
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ =
       SUB84(tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
       SUB84((ulong)tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi >> 0x20,0);
  if (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = (_Rb_tree_color)
             tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
       = SUB84((ulong)tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               >> 0x20,0);
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)
              tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  if (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = (_Base_ptr)tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = (_Base_ptr)
             tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  miniminer_manual.m_inclusion_order._M_t._M_impl._0_4_ =
       SUB84(tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl._4_4_ =
       SUB84((ulong)tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi >> 0x20,0);
  if (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       SUB84((ulong)tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr >>
             0x20,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
       SUB84(tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,0);
  miniminer_manual.m_inclusion_order._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
       (undefined4)
       ((ulong)tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi >> 0x20);
  if (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_10._M_len = 8;
  __l_10._M_array = (iterator)&miniminer_manual;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&all_transactions,__l_10,(allocator_type *)&miniminer_pool);
  lVar30 = 0x80;
  do {
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar30);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    psVar15 = all_transactions.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar30 = lVar30 + -0x10;
  } while (lVar30 != 0);
  p_Var1 = &tx_dims._M_t._M_impl.super__Rb_tree_header;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  psVar31 = all_transactions.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar31 == psVar15) {
      miniminer_manual.m_ready_to_calculate = false;
      miniminer_manual._1_7_ = 0;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ = 500;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 999;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x3e8;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           2000;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           0;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = 0x9c4;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = 0;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           0xd05;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = 0x1e78;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ = 0;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = 0x2bbf;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = 0;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x5b22;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0xc350;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x4c4b40;
      __l_11._M_len = 0xc;
      __l_11._M_array = (iterator)&miniminer_manual;
      std::vector<CFeeRate,_std::allocator<CFeeRate>_>::vector
                (&various_normal_feerates,__l_11,(allocator_type *)&miniminer_pool);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
      ;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      miniminer_pool.m_ready_to_calculate = false;
      miniminer_pool._1_7_ = 0;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ = 0;
      bytes.m_size = 0x20;
      bytes.m_data = &miniminer_pool.m_ready_to_calculate;
      GetRandBytes(bytes);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      miniminer_manual.m_ready_to_calculate = miniminer_pool.m_ready_to_calculate;
      miniminer_manual._1_7_ = miniminer_pool._1_7_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
           miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           0;
      hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      bytes_00.m_size = 0x20;
      bytes_00.m_data = (uchar *)&hash_1;
      GetRandBytes(bytes_00);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           hash_1.super_base_blob<256U>.m_data._M_elems._16_4_;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ =
           hash_1.super_base_blob<256U>.m_data._M_elems._20_4_;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           hash_1.super_base_blob<256U>.m_data._M_elems._24_4_;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = hash_1.super_base_blob<256U>.m_data._M_elems._28_4_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           hash_1.super_base_blob<256U>.m_data._M_elems._0_4_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = hash_1.super_base_blob<256U>.m_data._M_elems._4_4_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = hash_1.super_base_blob<256U>.m_data._M_elems._8_4_;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           hash_1.super_base_blob<256U>.m_data._M_elems._12_4_;
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl.super__Rb_tree_header._M_header.
      _4_4_ = 3;
      __l_12._M_len = 2;
      __l_12._M_array = (iterator)&miniminer_manual;
      std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
                (&nonexistent_outpoints,__l_12,(allocator_type *)&descendant_caches);
      pCVar14 = nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_start !=
          nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pCVar37 = nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_6a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_6a0 = "";
          local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_01.m_end = (iterator)0xc2;
          file_01.m_begin = (iterator)&local_6a8;
          msg_01.m_end = in_R9;
          msg_01.m_begin = pcVar32;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_6b8,msg_01);
          _cVar40 = 0x44b76d;
          bVar16 = CTxMemPool::isSpent(this_00,pCVar37);
          miniminer_pool.m_ready_to_calculate = !bVar16;
          miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ = 0;
          miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               _S_red;
          miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_cfceee;
          hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
               (long)"!pool.isSpent(outpoint)" + 0x17;
          miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ =
               miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
          miniminer_manual._0_8_ = &PTR__lazy_ostream_013ae1c8;
          miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               boost::unit_test::lazy_ostream::inst;
          miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&hash_1;
          local_6c8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_6c0 = "";
          pcVar32 = (char *)0x1;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&miniminer_pool,(lazy_ostream *)&miniminer_manual,1,0,WARN,
                     _cVar40,(size_t)&local_6c8,0xc2);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header);
          pCVar37 = pCVar37 + 1;
        } while (pCVar37 != pCVar14);
      }
      pCVar39 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_d28 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
          super__Vector_impl_data._M_start !=
          various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&nonexistent_outpoints);
          local_6d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_6d0 = "";
          local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
          _cVar40 = 0x44b8d4;
          file_02.m_end = (iterator)0xc5;
          file_02.m_begin = (iterator)&local_6d8;
          msg_02.m_end = in_R9;
          msg_02.m_begin = pcVar32;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_6e8,msg_02);
          hash_1.super_base_blob<256U>.m_data._M_elems[0] = miniminer_manual.m_ready_to_calculate;
          hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
          miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
               miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
          miniminer_pool._0_8_ = &PTR__lazy_ostream_013ae1c8;
          miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               boost::unit_test::lazy_ostream::inst;
          miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)&descendant_caches;
          local_6f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_6f0 = "";
          pvVar33 = (iterator)0x1;
          pvVar34 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&hash_1,(lazy_ostream *)&miniminer_pool,1,0,WARN,_cVar40,
                     (size_t)&local_6f8,0xc5);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)(hash_1.super_base_blob<256U>.m_data._M_elems + 0x10));
          ::node::MiniMiner::CalculateBumpFees
                    ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                      *)&miniminer_pool,&miniminer_manual,local_d28);
          local_708 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_700 = "";
          local_718 = &boost::unit_test::basic_cstring<char_const>::null;
          local_710 = &boost::unit_test::basic_cstring<char_const>::null;
          _cVar40 = 0x44b9f7;
          file_03.m_end = (iterator)0xc7;
          file_03.m_begin = (iterator)&local_708;
          msg_03.m_end = pvVar34;
          msg_03.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_718,msg_03);
          descendant_caches._M_t._M_impl._0_8_ =
               CONCAT71(descendant_caches._M_t._M_impl._1_7_,miniminer_manual.m_ready_to_calculate)
               ^ 1;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          bump_fees_all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_cfcf47;
          bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
          hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
               hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
          hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
          hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst
          ;
          hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &bump_fees_all_parents;
          local_728 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_720 = "";
          pvVar33 = (iterator)0x1;
          pvVar34 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&descendant_caches,(lazy_ostream *)&hash_1,1,0,WARN,_cVar40
                     ,(size_t)&local_728,199);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          local_738 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_730 = "";
          local_748 = &boost::unit_test::basic_cstring<char_const>::null;
          local_740 = &boost::unit_test::basic_cstring<char_const>::null;
          file_04.m_end = (iterator)0xc8;
          file_04.m_begin = (iterator)&local_738;
          msg_04.m_end = pvVar34;
          msg_04.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                     (size_t)&local_748,msg_04);
          _cVar40 = 0x44bb1d;
          bVar16 = sanity_check((miniminer_tests *)
                                all_transactions.
                                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 *)all_transactions.
                                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                 *)&miniminer_pool);
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          bump_fees_all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_cfcf5d;
          bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (long)"sanity_check(all_transactions, bump_fees)" + 0x29;
          hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
               hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
          hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
          hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst
          ;
          hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &bump_fees_all_parents;
          local_758 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_750 = "";
          pvVar33 = (iterator)0x1;
          pvVar34 = (iterator)0x0;
          descendant_caches._M_t._M_impl._0_1_ = bVar16;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&descendant_caches,(lazy_ostream *)&hash_1,1,0,WARN,_cVar40
                     ,(size_t)&local_758,200);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          local_768 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_760 = "";
          local_778 = &boost::unit_test::basic_cstring<char_const>::null;
          local_770 = &boost::unit_test::basic_cstring<char_const>::null;
          _cVar40 = 0x44bc29;
          file_05.m_end = (iterator)0xc9;
          file_05.m_begin = (iterator)&local_768;
          msg_05.m_end = pvVar34;
          msg_05.m_begin = pvVar33;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_778,msg_05);
          descendant_caches._M_t._M_impl._0_1_ =
               miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right
               == (_Base_ptr)
                  (((long)nonexistent_outpoints.
                          super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)nonexistent_outpoints.
                          super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7);
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          bump_fees_all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_cfcf67;
          bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (long)"bump_fees.size() == nonexistent_outpoints.size()" + 0x30;
          hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
               hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
          hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
          hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst
          ;
          hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &bump_fees_all_parents;
          local_788 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
          ;
          local_780 = "";
          pcVar32 = (char *)0x1;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&descendant_caches,(lazy_ostream *)&hash_1,1,0,WARN,_cVar40
                     ,(size_t)&local_788,0xc9);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          pCVar14 = nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (__k = nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start; __k != pCVar14; __k = __k + 1) {
            iVar25 = std::
                     _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     ::find((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                             *)&miniminer_pool,__k);
            local_798 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_790 = "";
            local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar40 = 0x44bd87;
            file_06.m_end = (iterator)0xcc;
            file_06.m_begin = (iterator)&local_798;
            msg_06.m_end = in_R9;
            msg_06.m_begin = pcVar32;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                       (size_t)&local_7a8,msg_06);
            descendant_caches._M_t._M_impl._0_1_ =
                 iVar25._M_node != (_Base_ptr)&miniminer_pool.m_to_be_replaced;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            bump_fees_all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_cfcf7d;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (long)"it != bump_fees.end()" + 0x15;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &bump_fees_all_parents;
            local_7b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_7b0 = "";
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&descendant_caches,(lazy_ostream *)&hash_1,1,0,WARN,
                       _cVar40,(size_t)&local_7b8,0xcc);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            local_7c8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_7c0 = "";
            local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_07.m_end = (iterator)0xcd;
            file_07.m_begin = (iterator)&local_7c8;
            msg_07.m_end = pvVar34;
            msg_07.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                       (size_t)&local_7d8,msg_07);
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffffffffff00;
            bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)0xf73bdc;
            _tx6_vsize = (undefined **)&iVar25._M_node[2]._M_parent;
            bumpfee0 = bumpfee0 & 0xffffffff00000000;
            _tx4_vsize = (undefined **)
                         CONCAT71(stack0xfffffffffffffba9,
                                  iVar25._M_node[2]._M_parent == (_Base_ptr)0x0);
            peStack_450 = (element_type *)0x0;
            sStack_448.pi_ = (sp_counted_base *)0x0;
            _tx5_vsize = (undefined **)0xeaa3ff;
            local_4d0 = (element_type *)0xeaa460;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae428;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx6_vsize;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&bumpfee0;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffffffffff00;
            descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae248;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)&miniminer_info;
            pcVar32 = (char *)0x1;
            in_R9 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                       REQUIRE,0xfd83bf,(size_t)&tx5_vsize,0xcd,&hash_1,"0",&descendant_caches);
            boost::detail::shared_count::~shared_count(&sStack_448);
          }
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                       *)&miniminer_pool);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
          ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
          if (miniminer_manual.m_entries.
              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(miniminer_manual.m_entries.
                            super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)miniminer_manual.m_entries.
                                  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)miniminer_manual.m_entries.
                                  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
          ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
          std::
          _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
          ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
          std::
          _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
          ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
          ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
          std::
          _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
          ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
          pCVar35 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          local_d28 = local_d28 + 1;
        } while (local_d28 != pCVar39);
        pCVar39 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
            super__Vector_impl_data._M_start !=
            various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          target_feerate =
               various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
               _M_impl.super__Vector_impl_data._M_start;
          do {
            ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_unspent_outpoints);
            local_7e8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_7e0 = "";
            local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar40 = 0x44c132;
            file_08.m_end = (iterator)0xd4;
            file_08.m_begin = (iterator)&local_7e8;
            msg_08.m_end = in_R9;
            msg_08.m_begin = pcVar32;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                       (size_t)&local_7f8,msg_08);
            hash_1.super_base_blob<256U>.m_data._M_elems[0] = miniminer_manual.m_ready_to_calculate;
            hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
            descendant_caches._M_t._M_impl._0_8_ = (long)"!mini_miner.IsReadyToCalculate()" + 1;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
            miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
                 miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
            miniminer_pool._0_8_ = &PTR__lazy_ostream_013ae1c8;
            miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 boost::unit_test::lazy_ostream::inst;
            local_808 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_800 = "";
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)&descendant_caches;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&hash_1,(lazy_ostream *)&miniminer_pool,1,0,WARN,_cVar40,
                       (size_t)&local_808,0xd4);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)(hash_1.super_base_blob<256U>.m_data._M_elems + 0x10));
            ::node::MiniMiner::CalculateBumpFees
                      ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)&miniminer_pool,&miniminer_manual,target_feerate);
            local_818 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_810 = "";
            local_828 = &boost::unit_test::basic_cstring<char_const>::null;
            local_820 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar40 = 0x44c256;
            file_09.m_end = (iterator)0xd6;
            file_09.m_begin = (iterator)&local_818;
            msg_09.m_end = pvVar34;
            msg_09.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                       (size_t)&local_828,msg_09);
            descendant_caches._M_t._M_impl._0_8_ =
                 CONCAT71(descendant_caches._M_t._M_impl._1_7_,miniminer_manual.m_ready_to_calculate
                         ) ^ 1;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            bump_fees_all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_cfcf47;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (long)"!mini_miner.IsReadyToCalculate()" + 0x20;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            local_838 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_830 = "";
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 (lazy_ostream *)&bump_fees_all_parents;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&descendant_caches,(lazy_ostream *)&hash_1,1,0,WARN,
                       _cVar40,(size_t)&local_838,0xd6);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            local_848 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_840 = "";
            local_858 = &boost::unit_test::basic_cstring<char_const>::null;
            local_850 = &boost::unit_test::basic_cstring<char_const>::null;
            file_10.m_end = (iterator)0xd7;
            file_10.m_begin = (iterator)&local_848;
            msg_10.m_end = pvVar34;
            msg_10.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                       (size_t)&local_858,msg_10);
            _cVar40 = 0x44c36f;
            bVar16 = sanity_check((miniminer_tests *)
                                  all_transactions.
                                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   *)all_transactions.
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                  (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                   *)&miniminer_pool);
            descendant_caches._M_t._M_impl._0_1_ = bVar16;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            bump_fees_all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_cfcf5d;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (long)"sanity_check(all_transactions, bump_fees)" + 0x29;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            local_868 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_860 = "";
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 (lazy_ostream *)&bump_fees_all_parents;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&descendant_caches,(lazy_ostream *)&hash_1,1,0,WARN,
                       _cVar40,(size_t)&local_868,0xd7);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            local_878 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_870 = "";
            local_888 = &boost::unit_test::basic_cstring<char_const>::null;
            local_880 = &boost::unit_test::basic_cstring<char_const>::null;
            file_11.m_end = (iterator)0xd8;
            file_11.m_begin = (iterator)&local_878;
            msg_11.m_end = pvVar34;
            msg_11.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                       (size_t)&local_888,msg_11);
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffffffffff00;
            bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)0xf73bdc;
            bumpfee0 = (CAmount)miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header.
                                _M_header._M_right;
            tx2_feerate.nSatoshisPerK =
                 ((long)all_unspent_outpoints.
                        super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)all_unspent_outpoints.
                        super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
            peStack_450 = (element_type *)0x0;
            sStack_448.pi_ = (sp_counted_base *)0x0;
            _tx5_vsize = (undefined **)0xeaa3ff;
            local_4d0 = (element_type *)0xeaa460;
            _tx6_vsize = (undefined **)&bumpfee0;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae0c8;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx6_vsize;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&tx2_feerate;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffffffffff00;
            descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae0c8;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)&miniminer_info;
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x2;
            tx4_vsize._0_1_ =
                 (readonly_property<bool>)
                 (readonly_property<bool>)
                 (miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_right == (_Base_ptr)tx2_feerate.nSatoshisPerK);
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                       REQUIRE,0xeaa7b5,(size_t)&tx5_vsize,0xd8,(COutPoint *)&hash_1,
                       "all_unspent_outpoints.size()",(_Base_ptr)&descendant_caches);
            boost::detail::shared_count::~shared_count(&sStack_448);
            peVar3 = tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar26 = std::
                     map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                     ::find(&tx_dims,&((tx0.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->hash).m_wrapped);
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
            ;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)
                  ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            bumpfee0 = Find<COutPoint,long>
                                 ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                   *)&miniminer_pool,(COutPoint *)&hash_1);
            if ((long)iVar26._M_node[2]._M_left < target_feerate->nSatoshisPerK) {
              local_8b8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
              ;
              local_8b0 = "";
              local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_12.m_end = (iterator)0xe1;
              file_12.m_begin = (iterator)&local_8b8;
              msg_12.m_end = pvVar34;
              msg_12.m_begin = pvVar33;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                         (size_t)&local_8c8,msg_12);
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)0xf73bdc;
              CVar27 = CFeeRate::GetFee(target_feerate,iVar26._M_node[2]._M_color);
              tx2_feerate.nSatoshisPerK = CVar27 - (long)iVar26._M_node[2]._M_parent;
              tx4_vsize._0_1_ =
                   (readonly_property<bool>)
                   (readonly_property<bool>)(bumpfee0 == tx2_feerate.nSatoshisPerK);
              peStack_450 = (element_type *)0x0;
              sStack_448.pi_ = (sp_counted_base *)0x0;
              _tx5_vsize = (undefined **)0xeaa3ff;
              local_4d0 = (element_type *)0xeaa460;
              _tx6_vsize = (undefined **)&bumpfee0;
              hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
              hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae428;
              hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   boost::unit_test::lazy_ostream::inst;
              hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx6_vsize;
              miniminer_info.
              super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&tx2_feerate;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae428;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)&miniminer_info;
              pvVar33 = (iterator)0x1;
              pvVar34 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                         REQUIRE,0xeaa7e3,(size_t)&tx5_vsize,0xe1,&hash_1,
                         "target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee",
                         &descendant_caches);
            }
            else {
              local_898 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
              ;
              local_890 = "";
              local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_13.m_end = (iterator)0xde;
              file_13.m_begin = (iterator)&local_898;
              msg_13.m_end = pvVar34;
              msg_13.m_begin = pvVar33;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                         (size_t)&local_8a8,msg_13);
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)0xf73bdc;
              tx2_feerate.nSatoshisPerK = tx2_feerate.nSatoshisPerK & 0xffffffff00000000;
              tx4_vsize._0_1_ = (readonly_property<bool>)(readonly_property<bool>)(bumpfee0 == 0);
              peStack_450 = (element_type *)0x0;
              sStack_448.pi_ = (sp_counted_base *)0x0;
              _tx5_vsize = (undefined **)0xeaa3ff;
              local_4d0 = (element_type *)0xeaa460;
              _tx6_vsize = (undefined **)&bumpfee0;
              hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
              hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae428;
              hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   boost::unit_test::lazy_ostream::inst;
              hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx6_vsize;
              miniminer_info.
              super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&tx2_feerate;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae248;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)&miniminer_info;
              pvVar33 = (iterator)0x1;
              pvVar34 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                         REQUIRE,0xeaa7e3,(size_t)&tx5_vsize,0xde,&hash_1,"0",&descendant_caches);
            }
            boost::detail::shared_count::~shared_count(&sStack_448);
            iVar26 = std::
                     map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                     ::find(&tx_dims,&((tx2.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->hash).m_wrapped);
            iVar28 = std::
                     map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                     ::find(&tx_dims,&((tx3.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->hash).m_wrapped);
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 (long)&(iVar26._M_node[2]._M_parent)->_M_color +
                 (long)&(iVar28._M_node[2]._M_parent)->_M_color;
            CFeeRate::CFeeRate(&tx2_feerate,(CAmount *)&hash_1,
                               iVar28._M_node[2]._M_color + iVar26._M_node[2]._M_color);
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)
                  ((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)
                  (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)
                  (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)
                  (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            bumpfee2 = Find<COutPoint,long>
                                 ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                   *)&miniminer_pool,(COutPoint *)&hash_1);
            if (tx2_feerate.nSatoshisPerK < target_feerate->nSatoshisPerK) {
              local_8f8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
              ;
              local_8f0 = "";
              local_908._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   &boost::unit_test::basic_cstring<char_const>::null;
              local_900 = &boost::unit_test::basic_cstring<char_const>::null;
              file_14.m_end = (iterator)0xee;
              file_14.m_begin = (iterator)&local_8f8;
              msg_14.m_end = pvVar34;
              msg_14.m_begin = pvVar33;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                         (size_t)&local_908,msg_14);
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)0xf73bdc;
              CVar27 = CFeeRate::GetFee(target_feerate,iVar26._M_node[2]._M_color);
              tx4_feerate.nSatoshisPerK = CVar27 - (long)iVar26._M_node[2]._M_parent;
              tx4_vsize._0_1_ =
                   (readonly_property<bool>)
                   (readonly_property<bool>)(bumpfee2 == tx4_feerate.nSatoshisPerK);
              peStack_450 = (element_type *)0x0;
              sStack_448.pi_ = (sp_counted_base *)0x0;
              _tx5_vsize = (undefined **)0xeaa3ff;
              local_4d0 = (element_type *)0xeaa460;
              _tx6_vsize = (undefined **)&bumpfee2;
              hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
              hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae428;
              hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   boost::unit_test::lazy_ostream::inst;
              hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx6_vsize;
              miniminer_info.
              super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&tx4_feerate;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae428;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)&miniminer_info;
              pvVar33 = (iterator)0x1;
              pvVar34 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                         REQUIRE,0xeaa831,(size_t)&tx5_vsize,0xee,&hash_1,
                         "target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee",
                         &descendant_caches);
            }
            else {
              local_8d8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
              ;
              local_8d0 = "";
              local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_15.m_end = (iterator)0xeb;
              file_15.m_begin = (iterator)&local_8d8;
              msg_15.m_end = pvVar34;
              msg_15.m_begin = pvVar33;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                         (size_t)&local_8e8,msg_15);
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)0xf73bdc;
              tx4_feerate.nSatoshisPerK = tx4_feerate.nSatoshisPerK & 0xffffffff00000000;
              tx4_vsize._0_1_ = (readonly_property<bool>)(readonly_property<bool>)(bumpfee2 == 0);
              peStack_450 = (element_type *)0x0;
              sStack_448.pi_ = (sp_counted_base *)0x0;
              _tx5_vsize = (undefined **)0xeaa3ff;
              local_4d0 = (element_type *)0xeaa460;
              _tx6_vsize = (undefined **)&bumpfee2;
              hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
              hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae428;
              hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   boost::unit_test::lazy_ostream::inst;
              hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx6_vsize;
              miniminer_info.
              super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&tx4_feerate;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae248;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)&miniminer_info;
              pvVar33 = (iterator)0x1;
              pvVar34 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                         REQUIRE,0xeaa831,(size_t)&tx5_vsize,0xeb,&hash_1,"0",&descendant_caches);
            }
            boost::detail::shared_count::~shared_count(&sStack_448);
            iVar26 = std::
                     map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                     ::find(&tx_dims,&((tx4.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->hash).m_wrapped);
            iVar28 = std::
                     map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                     ::find(&tx_dims,&((tx5.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->hash).m_wrapped);
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 (long)&(iVar26._M_node[2]._M_parent)->_M_color +
                 (long)&(iVar28._M_node[2]._M_parent)->_M_color;
            CFeeRate::CFeeRate(&tx4_feerate,(CAmount *)&hash_1,
                               iVar28._M_node[2]._M_color + iVar26._M_node[2]._M_color);
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)
                  ((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)
                  (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)
                  (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)
                  (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            bumpfee4 = Find<COutPoint,long>
                                 ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                   *)&miniminer_pool,(COutPoint *)&hash_1);
            if (tx4_feerate.nSatoshisPerK < target_feerate->nSatoshisPerK) {
              local_948 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
              ;
              local_940 = "";
              local_958._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   &boost::unit_test::basic_cstring<char_const>::null;
              local_950 = &boost::unit_test::basic_cstring<char_const>::null;
              file_16.m_end = (iterator)0x102;
              file_16.m_begin = (iterator)&local_948;
              msg_16.m_end = pvVar34;
              msg_16.m_begin = pvVar33;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                         (size_t)&local_958,msg_16);
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)0xf73bdc;
              CVar27 = CFeeRate::GetFee(target_feerate,iVar26._M_node[2]._M_color);
              it4_spent = CVar27 - (long)iVar26._M_node[2]._M_parent;
              _tx4_vsize = (undefined **)CONCAT71(stack0xfffffffffffffba9,bumpfee4 == it4_spent);
              peStack_450 = (element_type *)0x0;
              sStack_448.pi_ = (sp_counted_base *)0x0;
              _tx5_vsize = (undefined **)0xeaa3ff;
              local_4d0 = (element_type *)0xeaa460;
              _tx6_vsize = (undefined **)&bumpfee4;
              hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
              hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae428;
              hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   boost::unit_test::lazy_ostream::inst;
              hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx6_vsize;
              miniminer_info.
              super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&it4_spent;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae428;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)&miniminer_info;
              pcVar32 = (char *)0x1;
              in_R9 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                         REQUIRE,0xeaa87f,(size_t)&tx5_vsize,0x102,&hash_1,
                         "target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee",
                         &descendant_caches);
            }
            else {
              local_928 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
              ;
              local_920 = "";
              local_938 = &boost::unit_test::basic_cstring<char_const>::null;
              local_930 = &boost::unit_test::basic_cstring<char_const>::null;
              file_17.m_end = (iterator)0xff;
              file_17.m_begin = (iterator)&local_928;
              msg_17.m_end = pvVar34;
              msg_17.m_begin = pvVar33;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                         (size_t)&local_938,msg_17);
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)0xf73bdc;
              it4_spent = it4_spent & 0xffffffff00000000;
              _tx4_vsize = (undefined **)CONCAT71(stack0xfffffffffffffba9,bumpfee4 == 0);
              peStack_450 = (element_type *)0x0;
              sStack_448.pi_ = (sp_counted_base *)0x0;
              _tx5_vsize = (undefined **)0xeaa3ff;
              local_4d0 = (element_type *)0xeaa460;
              _tx6_vsize = (undefined **)&bumpfee4;
              hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
              hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae428;
              hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   boost::unit_test::lazy_ostream::inst;
              hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx6_vsize;
              miniminer_info.
              super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&it4_spent;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffffffffff00;
              descendant_caches._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae248;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)boost::unit_test::lazy_ostream::inst;
              descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)&miniminer_info;
              pcVar32 = (char *)0x1;
              in_R9 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                         REQUIRE,0xeaa87f,(size_t)&tx5_vsize,0xff,&hash_1,"0",&descendant_caches);
            }
            boost::detail::shared_count::~shared_count(&sStack_448);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         *)&miniminer_pool);
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
            ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
            if (miniminer_manual.m_entries.
                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(miniminer_manual.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)miniminer_manual.m_entries.
                                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)miniminer_manual.m_entries.
                                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
            ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
            std::
            _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
            ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
            ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
            target_feerate = target_feerate + 1;
            pCVar39 = various_normal_feerates.
                      super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          } while (target_feerate != pCVar35);
        }
        if (various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
            super__Vector_impl_data._M_start != pCVar39) {
          pCVar35 = various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            ::node::MiniMiner::MiniMiner(&miniminer_manual,this_00,&all_spent_outpoints);
            local_970 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_968 = "";
            local_980 = &boost::unit_test::basic_cstring<char_const>::null;
            local_978 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar40 = 0x44d326;
            file_18.m_end = (iterator)0x10a;
            file_18.m_begin = (iterator)&local_970;
            msg_18.m_end = in_R9;
            msg_18.m_begin = pcVar32;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                       (size_t)&local_980,msg_18);
            hash_1.super_base_blob<256U>.m_data._M_elems[0] = miniminer_manual.m_ready_to_calculate;
            hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
            descendant_caches._M_t._M_impl._0_8_ =
                 (long)"!mini_miner_all_spent.IsReadyToCalculate()" + 1;
            descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (long)"!mini_miner_all_spent.IsReadyToCalculate()" + 0x2a;
            miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
                 miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
            miniminer_pool._0_8_ = &PTR__lazy_ostream_013ae1c8;
            miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 boost::unit_test::lazy_ostream::inst;
            local_990 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_988 = "";
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)&descendant_caches;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&hash_1,(lazy_ostream *)&miniminer_pool,1,0,WARN,_cVar40,
                       (size_t)&local_990,0x10a);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)(hash_1.super_base_blob<256U>.m_data._M_elems + 0x10));
            ::node::MiniMiner::CalculateBumpFees
                      ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)&descendant_caches,&miniminer_manual,pCVar35);
            local_9a0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_998 = "";
            local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar40 = 0x44d43f;
            file_19.m_end = (iterator)0x10c;
            file_19.m_begin = (iterator)&local_9a0;
            msg_19.m_end = pvVar34;
            msg_19.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                       (size_t)&local_9b0,msg_19);
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 CONCAT71(hash_1.super_base_blob<256U>.m_data._M_elems._1_7_,
                          miniminer_manual.m_ready_to_calculate) ^ 1;
            hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
            hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
            bump_fees_all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_cfd029;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (long)"!mini_miner_all_spent.IsReadyToCalculate()" + 0x2a;
            miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
                 miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
            miniminer_pool._0_8_ = &PTR__lazy_ostream_013ae1c8;
            miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 boost::unit_test::lazy_ostream::inst;
            miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)&bump_fees_all_parents;
            local_9c0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_9b8 = "";
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&hash_1,(lazy_ostream *)&miniminer_pool,1,0,WARN,_cVar40,
                       (size_t)&local_9c0,0x10c);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)(hash_1.super_base_blob<256U>.m_data._M_elems + 0x10));
            local_9d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_9c8 = "";
            local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_20.m_end = (iterator)0x10d;
            file_20.m_begin = (iterator)&local_9d0;
            msg_20.m_end = pvVar34;
            msg_20.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                       (size_t)&local_9e0,msg_20);
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffffffffff00;
            bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae088;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)0xf73bdc;
            bumpfee0 = descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count;
            tx2_feerate.nSatoshisPerK =
                 ((long)all_spent_outpoints.
                        super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)all_spent_outpoints.
                        super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
            tx4_vsize._0_1_ =
                 (readonly_property<bool>)
                 (readonly_property<bool>)
                 (descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                 tx2_feerate.nSatoshisPerK);
            peStack_450 = (element_type *)0x0;
            sStack_448.pi_ = (sp_counted_base *)0x0;
            _tx5_vsize = (undefined **)0xeaa3ff;
            local_4d0 = (element_type *)0xeaa460;
            _tx6_vsize = (undefined **)&bumpfee0;
            miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ =
                 miniminer_pool.m_to_be_replaced._M_t._M_impl._0_8_ & 0xffffffffffffff00;
            miniminer_pool._0_8_ = &PTR__lazy_ostream_013ae0c8;
            miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 boost::unit_test::lazy_ostream::inst;
            miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)&tx6_vsize;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&tx2_feerate;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae0c8;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &miniminer_info;
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&tx4_vsize,(lazy_ostream *)&bump_fees_all_parents,1,2,
                       REQUIRE,0xeaa8f8,(size_t)&tx5_vsize,0x10d,&miniminer_pool,
                       "all_spent_outpoints.size()",&hash_1);
            boost::detail::shared_count::~shared_count(&sStack_448);
            ::node::MiniMiner::MiniMiner(&miniminer_pool,this_00,&all_parent_outputs);
            local_9f0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_9e8 = "";
            local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
            local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar40 = 0x44d721;
            file_21.m_end = (iterator)0x10f;
            file_21.m_begin = (iterator)&local_9f0;
            msg_21.m_end = pvVar34;
            msg_21.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                       (size_t)&local_a00,msg_21);
            bump_fees_all_parents._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            _tx4_vsize = (undefined **)0xeaa92f;
            peStack_450 = (element_type *)0xeaa95a;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx4_vsize;
            local_a10 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_a08 = "";
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&bump_fees_all_parents,(lazy_ostream *)&hash_1,1,0,WARN,
                       _cVar40,(size_t)&local_a10,0x10f);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                      );
            ::node::MiniMiner::CalculateBumpFees(&bump_fees_all_parents,&miniminer_pool,pCVar35);
            local_a20 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_a18 = "";
            local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
            local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
            _cVar40 = 0x44d84a;
            file_22.m_end = (iterator)0x111;
            file_22.m_begin = (iterator)&local_a20;
            msg_22.m_end = pvVar34;
            msg_22.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                       (size_t)&local_a30,msg_22);
            _tx4_vsize = (undefined **)
                         (CONCAT71(stack0xfffffffffffffba9,miniminer_pool.m_ready_to_calculate) ^ 1)
            ;
            peStack_450 = (element_type *)0x0;
            sStack_448.pi_ = (sp_counted_base *)0x0;
            _tx5_vsize = (undefined **)0xeaa92e;
            local_4d0 = (element_type *)0xeaa95a;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx5_vsize;
            local_a40 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_a38 = "";
            pvVar33 = (iterator)0x1;
            pvVar34 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&tx4_vsize,(lazy_ostream *)&hash_1,1,0,WARN,_cVar40,
                       (size_t)&local_a40,0x111);
            boost::detail::shared_count::~shared_count(&sStack_448);
            local_a50 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
            ;
            local_a48 = "";
            local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
            local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
            file_23.m_end = (iterator)0x112;
            file_23.m_begin = (iterator)&local_a50;
            msg_23.m_end = pvVar34;
            msg_23.m_begin = pvVar33;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,
                       (size_t)&local_a60,msg_23);
            local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
            _tx5_vsize = &PTR__lazy_ostream_013ae088;
            sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_4c0 = (_Base_ptr)0xf73bdc;
            bumpfee2 = bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_node_count;
            tx4_feerate.nSatoshisPerK =
                 ((long)all_parent_outputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)all_parent_outputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
            _tx6_vsize = (undefined **)
                         CONCAT71(stack0xfffffffffffff531,
                                  bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count == tx4_feerate.nSatoshisPerK);
            local_ac8 = (element_type *)0x0;
            sStack_ac0.pi_ = (sp_counted_base *)0x0;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_cf3b10;
            miniminer_info.
            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xeaa460;
            bumpfee0 = (CAmount)&bumpfee2;
            hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
            hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae0c8;
            hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &bumpfee0;
            tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
            peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
            _tx4_vsize = &PTR__lazy_ostream_013ae0c8;
            sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_440 = &tx2_feerate;
            pcVar32 = (char *)0x1;
            in_R9 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&tx6_vsize,(lazy_ostream *)&tx5_vsize,1,2,REQUIRE,
                       0xeaa95b,(size_t)&miniminer_info,0x112,
                       (_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)&hash_1,"all_parent_outputs.size()",(assertion_result *)&tx4_vsize);
            boost::detail::shared_count::~shared_count(&sStack_ac0);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)&hash_1,&bump_fees_all_parents._M_t);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::_Rb_tree(&local_3f8,
                       (_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                        *)&descendant_caches);
            lVar30 = 0;
            do {
              local_a70 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
              ;
              local_a68 = "";
              local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
              local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
              file_24.m_end = (iterator)0x116;
              file_24.m_begin = (iterator)&local_a70;
              msg_24.m_end = in_R9;
              msg_24.m_begin = pcVar32;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
                         (size_t)&local_a80,msg_24);
              puVar38 = hash_1.super_base_blob<256U>.m_data._M_elems + lVar30;
              _cVar40 = 0x44db68;
              bVar16 = sanity_check((miniminer_tests *)
                                    all_transactions.
                                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     *)all_transactions.
                                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                                    (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                     *)puVar38);
              _tx5_vsize = (undefined **)CONCAT71(stack0xfffffffffffffb29,bVar16);
              local_4d0 = (element_type *)0x0;
              sStack_4c8.pi_ = (sp_counted_base *)0x0;
              _tx6_vsize = (undefined **)0xeaa744;
              local_ac8 = (element_type *)0xeaa76d;
              peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
              _tx4_vsize = &PTR__lazy_ostream_013ae1c8;
              sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              local_440 = (CFeeRate *)&tx6_vsize;
              local_a90 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
              ;
              local_a88 = "";
              pvVar33 = (iterator)0x1;
              pvVar34 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&tx5_vsize,(lazy_ostream *)&tx4_vsize,1,0,WARN,_cVar40,
                         (size_t)&local_a90,0x116);
              boost::detail::shared_count::~shared_count(&sStack_4c8);
              peVar3 = tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              iVar26 = std::
                       map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                       ::find(&tx_dims,&((tx0.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->hash).m_wrapped);
              puVar12 = &(peVar3->hash).m_wrapped;
              tx4_vsize._0_1_ =
                   (readonly_property<bool>)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
              tx4_vsize._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
              tx4_vsize._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
              tx4_vsize._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
              unique0x10004499 = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
              unique0x1000449a = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
              unique0x1000449b = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
              unique0x1000449c = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
              peStack_450 = *(element_type **)
                             ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              sStack_448.pi_ =
                   *(sp_counted_base **)
                    ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
              local_440 = *(CFeeRate **)
                           ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
              local_438 = 0;
              tx4_feerate.nSatoshisPerK =
                   Find<COutPoint,long>
                             ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                               *)puVar38,(COutPoint *)&tx4_vsize);
              if ((long)iVar26._M_node[2]._M_left < pCVar35->nSatoshisPerK) {
                local_ae0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                ;
                local_ad8 = "";
                local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_25.m_end = (iterator)0x11f;
                file_25.m_begin = (iterator)&local_ae0;
                msg_25.m_end = pvVar34;
                msg_25.m_begin = pvVar33;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,
                           (size_t)&local_af0,msg_25);
                local_ac8 = (element_type *)((ulong)local_ac8 & 0xffffffffffffff00);
                _tx6_vsize = &PTR__lazy_ostream_013ae088;
                sStack_ac0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_ab8 = (_Base_ptr)0xf73bdc;
                CVar27 = CFeeRate::GetFee(pCVar35,iVar26._M_node[2]._M_color);
                bumpfee4 = CVar27 - (long)iVar26._M_node[2]._M_parent;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(miniminer_info.
                                       super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       tx4_feerate.nSatoshisPerK == bumpfee4);
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
                local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
                tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
                peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
                _tx4_vsize = &PTR__lazy_ostream_013ae428;
                sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_440 = &tx2_feerate;
                bumpfee2 = (CAmount)&bumpfee4;
                local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
                _tx5_vsize = &PTR__lazy_ostream_013ae428;
                sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_4c0 = (_Base_ptr)&bumpfee2;
                pvVar33 = (iterator)0x1;
                pvVar34 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&miniminer_info,(lazy_ostream *)&tx6_vsize,1,2,
                           REQUIRE,0xeaa992,(size_t)&bumpfee0,0x11f,&tx4_vsize,
                           "target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee",
                           &tx5_vsize);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &miniminer_info.
                            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                local_aa0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                ;
                local_a98 = "";
                local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_26.m_end = (iterator)0x11c;
                file_26.m_begin = (iterator)&local_aa0;
                msg_26.m_end = pvVar34;
                msg_26.m_begin = pvVar33;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
                           (size_t)&local_ab0,msg_26);
                local_ac8 = (element_type *)((ulong)local_ac8 & 0xffffffffffffff00);
                _tx6_vsize = &PTR__lazy_ostream_013ae088;
                sStack_ac0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_ab8 = (_Base_ptr)0xf73bdc;
                bumpfee4 = bumpfee4 & 0xffffffff00000000;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(miniminer_info.
                                       super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       tx4_feerate.nSatoshisPerK == 0);
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
                local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
                tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
                peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
                _tx4_vsize = &PTR__lazy_ostream_013ae428;
                sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_440 = &tx2_feerate;
                bumpfee2 = (CAmount)&bumpfee4;
                local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
                _tx5_vsize = &PTR__lazy_ostream_013ae248;
                sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_4c0 = (_Base_ptr)&bumpfee2;
                pvVar33 = (iterator)0x1;
                pvVar34 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&miniminer_info,(lazy_ostream *)&tx6_vsize,1,2,
                           REQUIRE,0xeaa992,(size_t)&bumpfee0,0x11c,&tx4_vsize,"0",&tx5_vsize);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &miniminer_info.
                            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              peVar3 = tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              iVar26 = std::
                       map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                       ::find(&tx_dims,&((tx2.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->hash).m_wrapped);
              p_Var5 = iVar26._M_node[2]._M_left;
              puVar12 = &(peVar3->hash).m_wrapped;
              tx4_vsize._0_1_ =
                   (readonly_property<bool>)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
              tx4_vsize._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
              tx4_vsize._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
              tx4_vsize._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
              unique0x100044d9 = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
              unique0x100044da = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
              unique0x100044db = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
              unique0x100044dc = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
              peStack_450 = *(element_type **)
                             ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              sStack_448.pi_ =
                   *(sp_counted_base **)
                    ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
              local_440 = *(CFeeRate **)
                           ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
              local_438 = 0;
              bumpfee4 = Find<COutPoint,long>
                                   ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                     *)puVar38,(COutPoint *)&tx4_vsize);
              if ((long)p_Var5 < pCVar35->nSatoshisPerK) {
                local_b20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                ;
                local_b18 = "";
                local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
                file_27.m_end = (iterator)0x12a;
                file_27.m_begin = (iterator)&local_b20;
                msg_27.m_end = pvVar34;
                msg_27.m_begin = pvVar33;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,
                           (size_t)&local_b30,msg_27);
                local_ac8 = (element_type *)((ulong)local_ac8 & 0xffffffffffffff00);
                _tx6_vsize = &PTR__lazy_ostream_013ae088;
                sStack_ac0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_ab8 = (_Base_ptr)0xf73bdc;
                CVar27 = CFeeRate::GetFee(pCVar35,iVar26._M_node[2]._M_color);
                it4_spent = CVar27 - (long)iVar26._M_node[2]._M_parent;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(miniminer_info.
                                       super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       bumpfee4 == it4_spent);
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
                local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
                tx2_feerate.nSatoshisPerK = (CAmount)&bumpfee4;
                peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
                _tx4_vsize = &PTR__lazy_ostream_013ae428;
                sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_440 = &tx2_feerate;
                bumpfee2 = (CAmount)&it4_spent;
                local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
                _tx5_vsize = &PTR__lazy_ostream_013ae428;
                sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_4c0 = (_Base_ptr)&bumpfee2;
                pvVar33 = (iterator)0x1;
                pvVar34 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&miniminer_info,(lazy_ostream *)&tx6_vsize,1,2,
                           REQUIRE,0xeaa99c,(size_t)&bumpfee0,0x12a,&tx4_vsize,
                           "target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee",
                           &tx5_vsize);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &miniminer_info.
                            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                local_b00 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                ;
                local_af8 = "";
                local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
                file_28.m_end = (iterator)0x127;
                file_28.m_begin = (iterator)&local_b00;
                msg_28.m_end = pvVar34;
                msg_28.m_begin = pvVar33;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,
                           (size_t)&local_b10,msg_28);
                local_ac8 = (element_type *)((ulong)local_ac8 & 0xffffffffffffff00);
                _tx6_vsize = &PTR__lazy_ostream_013ae088;
                sStack_ac0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_ab8 = (_Base_ptr)0xf73bdc;
                it4_spent = it4_spent & 0xffffffff00000000;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(miniminer_info.
                                       super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,bumpfee4 == 0
                                      );
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
                local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
                tx2_feerate.nSatoshisPerK = (CAmount)&bumpfee4;
                peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
                _tx4_vsize = &PTR__lazy_ostream_013ae428;
                sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_440 = &tx2_feerate;
                bumpfee2 = (CAmount)&it4_spent;
                local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
                _tx5_vsize = &PTR__lazy_ostream_013ae248;
                sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_4c0 = (_Base_ptr)&bumpfee2;
                pvVar33 = (iterator)0x1;
                pvVar34 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&miniminer_info,(lazy_ostream *)&tx6_vsize,1,2,
                           REQUIRE,0xeaa99c,(size_t)&bumpfee0,0x127,&tx4_vsize,"0",&tx5_vsize);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &miniminer_info.
                            super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              peVar3 = tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              iVar26 = std::
                       map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                       ::find(&tx_dims,&((tx4.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->hash).m_wrapped);
              p_Var5 = iVar26._M_node[2]._M_left;
              puVar12 = &(peVar3->hash).m_wrapped;
              tx4_vsize._0_1_ =
                   (readonly_property<bool>)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
              tx4_vsize._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
              tx4_vsize._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
              tx4_vsize._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
              unique0x10004519 = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
              unique0x1000451a = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
              unique0x1000451b = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
              unique0x1000451c = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
              peStack_450 = *(element_type **)
                             ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              sStack_448.pi_ =
                   *(sp_counted_base **)
                    ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
              local_440 = *(CFeeRate **)
                           ((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
              local_438 = 0;
              it4_spent = Find<COutPoint,long>
                                    ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                      *)puVar38,(COutPoint *)&tx4_vsize);
              if ((long)p_Var5 < pCVar35->nSatoshisPerK) {
                local_b60 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                ;
                local_b58 = "";
                local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
                file_29.m_end = (iterator)0x135;
                file_29.m_begin = (iterator)&local_b60;
                msg_29.m_end = pvVar34;
                msg_29.m_begin = pvVar33;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,
                           (size_t)&local_b70,msg_29);
                local_ac8 = (element_type *)((ulong)local_ac8 & 0xffffffffffffff00);
                _tx6_vsize = &PTR__lazy_ostream_013ae088;
                sStack_ac0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_ab8 = (_Base_ptr)0xf73bdc;
                CVar27 = CFeeRate::GetFee(pCVar35,iVar26._M_node[2]._M_color);
                local_b78 = CVar27 - (long)iVar26._M_node[2]._M_parent;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(miniminer_info.
                                       super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       it4_spent == local_b78);
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
                local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
                tx2_feerate.nSatoshisPerK = (CAmount)&it4_spent;
                peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
                _tx4_vsize = &PTR__lazy_ostream_013ae428;
                sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_440 = &tx2_feerate;
                bumpfee2 = (CAmount)&local_b78;
                local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
                _tx5_vsize = &PTR__lazy_ostream_013ae428;
                sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_4c0 = (_Base_ptr)&bumpfee2;
                pcVar32 = (char *)0x1;
                in_R9 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&miniminer_info,(lazy_ostream *)&tx6_vsize,1,2,
                           REQUIRE,0xeaa9a6,(size_t)&bumpfee0,0x135,&tx4_vsize,
                           "target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee",
                           &tx5_vsize);
              }
              else {
                local_b40 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                ;
                local_b38 = "";
                local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
                file_30.m_end = (iterator)0x132;
                file_30.m_begin = (iterator)&local_b40;
                msg_30.m_end = pvVar34;
                msg_30.m_begin = pvVar33;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                           (size_t)&local_b50,msg_30);
                local_ac8 = (element_type *)((ulong)local_ac8 & 0xffffffffffffff00);
                _tx6_vsize = &PTR__lazy_ostream_013ae088;
                sStack_ac0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_ab8 = (_Base_ptr)0xf73bdc;
                local_b78 = local_b78 & 0xffffffff00000000;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT71(miniminer_info.
                                       super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       it4_spent == 0);
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                miniminer_info.
                super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
                local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
                tx2_feerate.nSatoshisPerK = (CAmount)&it4_spent;
                peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
                _tx4_vsize = &PTR__lazy_ostream_013ae428;
                sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_440 = &tx2_feerate;
                bumpfee2 = (CAmount)&local_b78;
                local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
                _tx5_vsize = &PTR__lazy_ostream_013ae248;
                sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_4c0 = (_Base_ptr)&bumpfee2;
                pcVar32 = (char *)0x1;
                in_R9 = (iterator)0x2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&miniminer_info,(lazy_ostream *)&tx6_vsize,1,2,
                           REQUIRE,0xeaa9a6,(size_t)&bumpfee0,0x132,&tx4_vsize,"0",&tx5_vsize);
              }
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         &miniminer_info.
                          super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              lVar30 = lVar30 + 0x30;
            } while (lVar30 != 0x60);
            lVar30 = 0x30;
            do {
              std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
              ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                           *)(hash_1.super_base_blob<256U>.m_data._M_elems + lVar30));
              lVar30 = lVar30 + -0x30;
            } while (lVar30 != -0x30);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~_Rb_tree(&bump_fees_all_parents._M_t);
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
            ::~_Rb_tree(&miniminer_pool.m_descendant_set_by_txid._M_t);
            if (miniminer_pool.m_entries.
                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(miniminer_pool.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)miniminer_pool.m_entries.
                                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)miniminer_pool.m_entries.
                                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
            ::~_Rb_tree(&miniminer_pool.m_entries_by_txid._M_t);
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&miniminer_pool.m_in_block._M_t);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~_Rb_tree(&miniminer_pool.m_bump_fees._M_t);
            std::
            _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
            ::~_Rb_tree(&miniminer_pool.m_inclusion_order._M_t);
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
            ::~_Rb_tree(&miniminer_pool.m_requested_outpoints_by_txid._M_t);
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&miniminer_pool.m_to_be_replaced._M_t);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~_Rb_tree((_Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         *)&descendant_caches);
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
            ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
            if (miniminer_manual.m_entries.
                super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(miniminer_manual.m_entries.
                              super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)miniminer_manual.m_entries.
                                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)miniminer_manual.m_entries.
                                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
            ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
            std::
            _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
            ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
            ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
            std::
            _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
            ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
            pCVar35 = pCVar35 + 1;
          } while (pCVar35 != pCVar39);
        }
      }
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      miniminer_info.
      super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pmVar29 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx0.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      miniminer_pool._0_4_ = pmVar29->vsize;
      pmVar29 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx1.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      hash_1.super_base_blob<256U>.m_data._M_elems._0_4_ = pmVar29->vsize;
      pmVar29 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx2.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      descendant_caches._M_t._M_impl._0_4_ = pmVar29->vsize;
      pmVar29 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx3.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      bump_fees_all_parents._M_t._M_impl._0_4_ = pmVar29->vsize;
      pmVar29 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx4.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      tx4_vsize = pmVar29->vsize;
      pmVar29 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx5.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      _tx5_vsize = (undefined **)CONCAT44(uStack_4d4,pmVar29->vsize);
      pmVar29 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx6.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      _tx6_vsize = (undefined **)CONCAT44(uStack_acc,pmVar29->vsize);
      pmVar29 = std::
                map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                ::at(&tx_dims,&((tx7.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->hash).m_wrapped);
      bumpfee0 = CONCAT44(bumpfee0._4_4_,pmVar29->vsize);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx0,(int *)&miniminer_pool,(int *)&miniminer_pool,&med_fee,
                 &med_fee);
      tx2_feerate.nSatoshisPerK._0_4_ =
           hash_1.super_base_blob<256U>.m_data._M_elems._0_4_ + miniminer_pool._0_4_;
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0x27;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx1,(int *)&hash_1,(int *)&tx2_feerate,&med_fee,
                 (long *)&miniminer_manual);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx2,(int *)&descendant_caches,(int *)&descendant_caches,&low_fee,
                 &low_fee);
      tx2_feerate.nSatoshisPerK._0_4_ =
           bump_fees_all_parents._M_t._M_impl._0_4_ + descendant_caches._M_t._M_impl._0_4_;
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0x188;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx3,(int *)&bump_fees_all_parents,(int *)&tx2_feerate,&high_fee,
                 (long *)&miniminer_manual);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx4,&tx4_vsize,&tx4_vsize,&low_fee,&low_fee);
      tx2_feerate.nSatoshisPerK._0_4_ = tx5_vsize + tx4_vsize;
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0x2a;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx5,&tx5_vsize,(int *)&tx2_feerate,&tx5_mod_fee,
                 (long *)&miniminer_manual);
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx6,&tx6_vsize,&tx6_vsize,&high_fee,&high_fee);
      tx2_feerate.nSatoshisPerK._0_4_ = (int)bumpfee0 + tx6_vsize;
      __args_4 = &miniminer_manual;
      miniminer_manual.m_ready_to_calculate = true;
      miniminer_manual._1_7_ = 0x188;
      std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
      emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
                ((vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>> *)
                 &miniminer_info,&tx7,(int *)&bumpfee0,(int *)&tx2_feerate,&low_fee,(long *)__args_4
                );
      peVar3 = tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
      ;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      puVar12 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
      pbVar13 = &((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar6 = *(undefined8 *)
               ((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar7 = *(undefined8 *)
               (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar8 = *(undefined8 *)
               (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar9 = *(undefined8 *)
               (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar8;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar8 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar9 >> 0x20,0);
      __l_13._M_len = 2;
      __l_13._M_array = (iterator)&miniminer_manual;
      descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           descendant_caches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_pool,__l_13,(less<transaction_identifier<false>_> *)&hash_1,
            (allocator_type *)&bump_fees_all_parents);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_pool);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_pool);
      peVar3 = tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar12 = &((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
      pbVar13 = &((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __l_14._M_len = 1;
      __l_14._M_array = (iterator)&miniminer_pool;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_14,(less<transaction_identifier<false>_> *)&hash_1,
            (allocator_type *)&bump_fees_all_parents);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      peVar3 = tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar12 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
      pbVar13 = &((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar6 = *(undefined8 *)
               ((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar7 = *(undefined8 *)
               (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar8 = *(undefined8 *)
               (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar9 = *(undefined8 *)
               (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar8;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar8 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar9 >> 0x20,0);
      __l_15._M_len = 2;
      __l_15._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_pool,__l_15,(less<transaction_identifier<false>_> *)&hash_1,
            (allocator_type *)&bump_fees_all_parents);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_pool);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_pool);
      peVar3 = tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar12 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
      pbVar13 = &((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __l_16._M_len = 1;
      __l_16._M_array = (iterator)&miniminer_pool;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_16,(less<transaction_identifier<false>_> *)&hash_1,
            (allocator_type *)&bump_fees_all_parents);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      peVar3 = tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar12 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
      pbVar13 = &((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar6 = *(undefined8 *)
               ((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar7 = *(undefined8 *)
               (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar8 = *(undefined8 *)
               (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar9 = *(undefined8 *)
               (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar8;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar8 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar9 >> 0x20,0);
      __l_17._M_len = 2;
      __l_17._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_pool,__l_17,(less<transaction_identifier<false>_> *)&hash_1,
            (allocator_type *)&bump_fees_all_parents);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_pool);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_pool);
      peVar3 = tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar12 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
      pbVar13 = &((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __l_18._M_len = 1;
      __l_18._M_array = (iterator)&miniminer_pool;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_18,(less<transaction_identifier<false>_> *)&hash_1,
            (allocator_type *)&bump_fees_all_parents);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      peVar3 = tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar12 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_manual.m_ready_to_calculate =
           (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_manual._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_manual._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_manual._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_manual._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_manual._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_manual._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_manual._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
      pbVar13 = &((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_manual.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
      miniminer_manual.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uVar6 = *(undefined8 *)
               ((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar7 = *(undefined8 *)
               (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar8 = *(undefined8 *)
               (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uVar9 = *(undefined8 *)
               (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
           (undefined4)uVar6;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
           (undefined4)((ulong)uVar6 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
           = (undefined4)uVar7;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_
           = (undefined4)((ulong)uVar7 >> 0x20);
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (undefined4)uVar8;
      miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (undefined4)((ulong)uVar8 >> 0x20);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._0_4_ = SUB84(uVar9,0);
      miniminer_manual.m_requested_outpoints_by_txid._M_t._M_impl._4_4_ =
           SUB84((ulong)uVar9 >> 0x20,0);
      __l_19._M_len = 2;
      __l_19._M_array = (iterator)&miniminer_manual;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_pool,__l_19,(less<transaction_identifier<false>_> *)&hash_1,
            (allocator_type *)&bump_fees_all_parents);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_pool);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_pool);
      peVar3 = tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      puVar12 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped;
      miniminer_pool.m_ready_to_calculate =
           (bool)(puVar12->super_base_blob<256U>).m_data._M_elems[0];
      miniminer_pool._1_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[1];
      miniminer_pool._2_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[2];
      miniminer_pool._3_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[3];
      miniminer_pool._4_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[4];
      miniminer_pool._5_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[5];
      miniminer_pool._6_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[6];
      miniminer_pool._7_1_ = (puVar12->super_base_blob<256U>).m_data._M_elems[7];
      pbVar13 = &((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>;
      miniminer_pool.m_to_be_replaced._M_t._M_impl._0_1_ = (pbVar13->m_data)._M_elems[8];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._1_1_ = (pbVar13->m_data)._M_elems[9];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._2_1_ = (pbVar13->m_data)._M_elems[10];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._3_1_ = (pbVar13->m_data)._M_elems[0xb];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._4_1_ = (pbVar13->m_data)._M_elems[0xc];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._5_1_ = (pbVar13->m_data)._M_elems[0xd];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._6_1_ = (pbVar13->m_data)._M_elems[0xe];
      miniminer_pool.m_to_be_replaced._M_t._M_impl._7_1_ = (pbVar13->m_data)._M_elems[0xf];
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      miniminer_pool.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)
            (((tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      __a = (allocator_type *)&bump_fees_all_parents;
      __l_20._M_len = 1;
      __l_20._M_array = (iterator)&miniminer_pool;
      std::
      set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
             *)&miniminer_manual,__l_20,(less<transaction_identifier<false>_> *)&hash_1,__a);
      std::
      _Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
                ((_Rb_tree<transaction_identifier<false>,std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>,std::_Select1st<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
                  *)&descendant_caches,&peVar3->hash,
                 (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)&miniminer_manual);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)&miniminer_manual);
      ::node::MiniMiner::MiniMiner(&miniminer_manual,&miniminer_info,&descendant_caches);
      ::node::MiniMiner::MiniMiner(&miniminer_pool,this_00,&all_unspent_outpoints);
      local_b88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_b80 = "";
      local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
      local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar40 = 0x44f023;
      file_31.m_end = (iterator)0x15e;
      file_31.m_begin = (iterator)&local_b88;
      msg_31.m_end = &__args_4->m_ready_to_calculate;
      msg_31.m_begin = (iterator)__a;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_b98,
                 msg_31);
      bump_fees_all_parents._M_t._M_impl._0_1_ = miniminer_manual.m_ready_to_calculate;
      bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _tx4_vsize = (undefined **)0xeaa9b0;
      peStack_450 = (element_type *)0xeaa9d5;
      hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
           hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
      hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx4_vsize;
      local_ba8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_ba0 = "";
      pvVar33 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bump_fees_all_parents,(lazy_ostream *)&hash_1,1,0,WARN,_cVar40
                 ,(size_t)&local_ba8,0x15e);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_bb8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_bb0 = "";
      local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar40 = 0x44f0f7;
      file_32.m_end = (iterator)0x15f;
      file_32.m_begin = (iterator)&local_bb8;
      msg_32.m_end = pvVar34;
      msg_32.m_begin = pvVar33;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_bc8,
                 msg_32);
      bump_fees_all_parents._M_t._M_impl._0_1_ = miniminer_pool.m_ready_to_calculate;
      bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _tx4_vsize = (undefined **)0xeaa9d6;
      peStack_450 = (element_type *)0xeaa9f9;
      hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
           hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
      hash_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = &tx4_vsize;
      local_bd8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_bd0 = "";
      pvVar33 = (iterator)0x1;
      pvVar34 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bump_fees_all_parents,(lazy_ostream *)&hash_1,1,0,WARN,_cVar40
                 ,(size_t)&local_bd8,0x15f);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      ::node::MiniMiner::Linearize
                ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  *)&hash_1,&miniminer_manual);
      ::node::MiniMiner::Linearize
                ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                  *)&local_3f8,&miniminer_pool);
      lVar30 = 0;
      do {
        local_be8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_be0 = "";
        local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_33.m_end = (iterator)0x162;
        file_33.m_begin = (iterator)&local_be8;
        msg_33.m_end = pvVar34;
        msg_33.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_bf8
                   ,msg_33);
        puVar38 = hash_1.super_base_blob<256U>.m_data._M_elems + lVar30;
        local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
        _tx5_vsize = &PTR__lazy_ostream_013ae088;
        sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_4c0 = (_Base_ptr)0xf73bdc;
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                             *)puVar38,
                            &(tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = bumpfee4 & 0xffffffff00000000;
        local_ac8 = (element_type *)0x0;
        sStack_ac0.pi_ = (sp_counted_base *)0x0;
        bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
        local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
        tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffffffffff00;
        bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae108;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&tx2_feerate;
        bumpfee2 = (CAmount)&bumpfee4;
        peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
        _tx4_vsize = &PTR__lazy_ostream_013ae248;
        sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_440 = (CFeeRate *)&bumpfee2;
        pvVar33 = (iterator)0x1;
        pvVar34 = (iterator)0x2;
        tx6_vsize._0_1_ = uVar17 == 0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx6_vsize,(lazy_ostream *)&tx5_vsize,1,2,REQUIRE,0xeaa9fa,
                   (size_t)&bumpfee0,0x162,&bump_fees_all_parents,"0",&tx4_vsize);
        boost::detail::shared_count::~shared_count(&sStack_ac0);
        local_c08 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c00 = "";
        local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
        file_34.m_end = (iterator)0x165;
        file_34.m_begin = (iterator)&local_c08;
        msg_34.m_end = pvVar34;
        msg_34.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_c18
                   ,msg_34);
        local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
        _tx5_vsize = &PTR__lazy_ostream_013ae088;
        sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_4c0 = (_Base_ptr)0xf73bdc;
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                             *)puVar38,
                            &(tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,1);
        tx6_vsize._0_1_ = uVar17 == 1;
        local_ac8 = (element_type *)0x0;
        sStack_ac0.pi_ = (sp_counted_base *)0x0;
        bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
        local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
        tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffffffffff00;
        bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae108;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&tx2_feerate;
        bumpfee2 = (CAmount)&bumpfee4;
        peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
        _tx4_vsize = &PTR__lazy_ostream_013ae248;
        sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_440 = (CFeeRate *)&bumpfee2;
        pvVar33 = (iterator)0x1;
        pvVar34 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx6_vsize,(lazy_ostream *)&tx5_vsize,1,2,REQUIRE,0xeaaa1a,
                   (size_t)&bumpfee0,0x165,&bump_fees_all_parents,"1",&tx4_vsize);
        boost::detail::shared_count::~shared_count(&sStack_ac0);
        local_c28 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c20 = "";
        local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
        file_35.m_end = (iterator)0x166;
        file_35.m_begin = (iterator)&local_c28;
        msg_35.m_end = pvVar34;
        msg_35.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_c38
                   ,msg_35);
        local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
        _tx5_vsize = &PTR__lazy_ostream_013ae088;
        sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_4c0 = (_Base_ptr)0xf73bdc;
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                             *)puVar38,
                            &(tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,1);
        tx6_vsize._0_1_ = uVar17 == 1;
        local_ac8 = (element_type *)0x0;
        sStack_ac0.pi_ = (sp_counted_base *)0x0;
        bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
        local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
        tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffffffffff00;
        bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae108;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&tx2_feerate;
        bumpfee2 = (CAmount)&bumpfee4;
        peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
        _tx4_vsize = &PTR__lazy_ostream_013ae248;
        sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_440 = (CFeeRate *)&bumpfee2;
        pvVar33 = (iterator)0x1;
        pvVar34 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx6_vsize,(lazy_ostream *)&tx5_vsize,1,2,REQUIRE,0xeaaa3a,
                   (size_t)&bumpfee0,0x166,&bump_fees_all_parents,"1",&tx4_vsize);
        boost::detail::shared_count::~shared_count(&sStack_ac0);
        local_c48 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c40 = "";
        local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
        file_36.m_end = (iterator)0x169;
        file_36.m_begin = (iterator)&local_c48;
        msg_36.m_end = pvVar34;
        msg_36.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_c58
                   ,msg_36);
        local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
        _tx5_vsize = &PTR__lazy_ostream_013ae088;
        sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_4c0 = (_Base_ptr)0xf73bdc;
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                             *)puVar38,
                            &(tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,2);
        tx6_vsize._0_1_ = uVar17 == 2;
        local_ac8 = (element_type *)0x0;
        sStack_ac0.pi_ = (sp_counted_base *)0x0;
        bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
        local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
        tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffffffffff00;
        bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae108;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&tx2_feerate;
        bumpfee2 = (CAmount)&bumpfee4;
        peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
        _tx4_vsize = &PTR__lazy_ostream_013ae248;
        sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_440 = (CFeeRate *)&bumpfee2;
        pvVar33 = (iterator)0x1;
        pvVar34 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx6_vsize,(lazy_ostream *)&tx5_vsize,1,2,REQUIRE,0xeaaa5a,
                   (size_t)&bumpfee0,0x169,&bump_fees_all_parents,"2",&tx4_vsize);
        boost::detail::shared_count::~shared_count(&sStack_ac0);
        local_c68 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c60 = "";
        local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
        file_37.m_end = (iterator)0x16a;
        file_37.m_begin = (iterator)&local_c68;
        msg_37.m_end = pvVar34;
        msg_37.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_c78
                   ,msg_37);
        local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
        _tx5_vsize = &PTR__lazy_ostream_013ae088;
        sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_4c0 = (_Base_ptr)0xf73bdc;
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                             *)puVar38,
                            &(tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,2);
        tx6_vsize._0_1_ = uVar17 == 2;
        local_ac8 = (element_type *)0x0;
        sStack_ac0.pi_ = (sp_counted_base *)0x0;
        bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
        local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
        tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffffffffff00;
        bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae108;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&tx2_feerate;
        bumpfee2 = (CAmount)&bumpfee4;
        peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
        _tx4_vsize = &PTR__lazy_ostream_013ae248;
        sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_440 = (CFeeRate *)&bumpfee2;
        pvVar33 = (iterator)0x1;
        pvVar34 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx6_vsize,(lazy_ostream *)&tx5_vsize,1,2,REQUIRE,0xeaaa7a,
                   (size_t)&bumpfee0,0x16a,&bump_fees_all_parents,"2",&tx4_vsize);
        boost::detail::shared_count::~shared_count(&sStack_ac0);
        local_c88 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_c80 = "";
        local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
        file_38.m_end = (iterator)0x16c;
        file_38.m_begin = (iterator)&local_c88;
        msg_38.m_end = pvVar34;
        msg_38.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_c98
                   ,msg_38);
        local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
        _tx5_vsize = &PTR__lazy_ostream_013ae088;
        sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_4c0 = (_Base_ptr)0xf73bdc;
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                             *)puVar38,
                            &(tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,3);
        tx6_vsize._0_1_ = uVar17 == 3;
        local_ac8 = (element_type *)0x0;
        sStack_ac0.pi_ = (sp_counted_base *)0x0;
        bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
        local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
        tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffffffffff00;
        bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae108;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&tx2_feerate;
        bumpfee2 = (CAmount)&bumpfee4;
        peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
        _tx4_vsize = &PTR__lazy_ostream_013ae248;
        sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_440 = (CFeeRate *)&bumpfee2;
        pvVar33 = (iterator)0x1;
        pvVar34 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx6_vsize,(lazy_ostream *)&tx5_vsize,1,2,REQUIRE,0xeaaa9a,
                   (size_t)&bumpfee0,0x16c,&bump_fees_all_parents,"3",&tx4_vsize);
        boost::detail::shared_count::~shared_count(&sStack_ac0);
        local_ca8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_ca0 = "";
        local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_39.m_end = (iterator)0x16d;
        file_39.m_begin = (iterator)&local_ca8;
        msg_39.m_end = pvVar34;
        msg_39.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_cb8
                   ,msg_39);
        local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
        _tx5_vsize = &PTR__lazy_ostream_013ae088;
        sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_4c0 = (_Base_ptr)0xf73bdc;
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                             *)puVar38,
                            &(tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,3);
        tx6_vsize._0_1_ = uVar17 == 3;
        local_ac8 = (element_type *)0x0;
        sStack_ac0.pi_ = (sp_counted_base *)0x0;
        bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
        local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
        tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffffffffff00;
        bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae108;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&tx2_feerate;
        bumpfee2 = (CAmount)&bumpfee4;
        peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
        _tx4_vsize = &PTR__lazy_ostream_013ae248;
        sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_440 = (CFeeRate *)&bumpfee2;
        pvVar33 = (iterator)0x1;
        pvVar34 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx6_vsize,(lazy_ostream *)&tx5_vsize,1,2,REQUIRE,0xeaaaba,
                   (size_t)&bumpfee0,0x16d,&bump_fees_all_parents,"3",&tx4_vsize);
        boost::detail::shared_count::~shared_count(&sStack_ac0);
        local_cc8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_cc0 = "";
        local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_40.m_end = (iterator)0x171;
        file_40.m_begin = (iterator)&local_cc8;
        msg_40.m_end = pvVar34;
        msg_40.m_begin = pvVar33;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_cd8
                   ,msg_40);
        local_4d0 = (element_type *)((ulong)local_4d0 & 0xffffffffffffff00);
        _tx5_vsize = &PTR__lazy_ostream_013ae088;
        sStack_4c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_4c0 = (_Base_ptr)0xf73bdc;
        uVar17 = Find<transaction_identifier<false>,unsigned_int>
                           ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                             *)puVar38,
                            &(tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->hash);
        tx4_feerate.nSatoshisPerK._0_4_ = uVar17;
        bumpfee4 = CONCAT44(bumpfee4._4_4_,4);
        _tx6_vsize = (undefined **)CONCAT71(stack0xfffffffffffff531,uVar17 == 4);
        local_ac8 = (element_type *)0x0;
        sStack_ac0.pi_ = (sp_counted_base *)0x0;
        bumpfee0 = (CAmount)anon_var_dwarf_cf3b10;
        local_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeaa460;
        tx2_feerate.nSatoshisPerK = (CAmount)&tx4_feerate;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
             0xffffffffffffff00;
        bump_fees_all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae108;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
        bump_fees_all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&tx2_feerate;
        bumpfee2 = (CAmount)&bumpfee4;
        peStack_450 = (element_type *)((ulong)peStack_450 & 0xffffffffffffff00);
        _tx4_vsize = &PTR__lazy_ostream_013ae248;
        sStack_448.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_440 = (CFeeRate *)&bumpfee2;
        __x = (_Link_type)&tx5_vsize;
        pvVar33 = (iterator)0x1;
        pvVar34 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx6_vsize,(lazy_ostream *)__x,1,2,REQUIRE,0xeaaada,
                   (size_t)&bumpfee0,0x171,&bump_fees_all_parents,"4",&tx4_vsize);
        boost::detail::shared_count::~shared_count(&sStack_ac0);
        lVar30 = lVar30 + 0x30;
      } while (lVar30 != 0x60);
      lVar30 = 0x30;
      do {
        std::
        _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                     *)(hash_1.super_base_blob<256U>.m_data._M_elems + lVar30));
        lVar30 = lVar30 + -0x30;
      } while (lVar30 != -0x30);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
      ::~_Rb_tree(&miniminer_pool.m_descendant_set_by_txid._M_t);
      if (miniminer_pool.m_entries.
          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        __x = (_Link_type)
              ((long)miniminer_pool.m_entries.
                     super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)miniminer_pool.m_entries.
                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        operator_delete(miniminer_pool.m_entries.
                        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__x);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::~_Rb_tree(&miniminer_pool.m_entries_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_pool.m_in_block._M_t);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree(&miniminer_pool.m_bump_fees._M_t);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
      ::~_Rb_tree(&miniminer_pool.m_inclusion_order._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
      ::~_Rb_tree(&miniminer_pool.m_requested_outpoints_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_pool.m_to_be_replaced._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>_>_>_>
      ::~_Rb_tree(&miniminer_manual.m_descendant_set_by_txid._M_t);
      if (miniminer_manual.m_entries.
          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        __x = (_Link_type)
              ((long)miniminer_manual.m_entries.
                     super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)miniminer_manual.m_entries.
                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        operator_delete(miniminer_manual.m_entries.
                        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)__x);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
      ::~_Rb_tree(&miniminer_manual.m_entries_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_manual.m_in_block._M_t);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~_Rb_tree(&miniminer_manual.m_bump_fees._M_t);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_unsigned_int>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_unsigned_int>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
      ::~_Rb_tree(&miniminer_manual.m_inclusion_order._M_t);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
      ::~_Rb_tree(&miniminer_manual.m_requested_outpoints_by_txid._M_t);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&miniminer_manual.m_to_be_replaced._M_t);
      std::
      _Rb_tree<transaction_identifier<false>,_std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>,_std::_Select1st<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
      ::~_Rb_tree(&descendant_caches._M_t);
      std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::
      ~vector(&miniminer_info);
      if (nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        __x = (_Link_type)
              ((long)nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)nonexistent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start);
        operator_delete(nonexistent_outpoints.
                        super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)__x);
      }
      if (various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        __x = (_Link_type)
              ((long)various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)various_normal_feerates.super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>.
                    _M_impl.super__Vector_impl_data._M_start);
        operator_delete(various_normal_feerates.
                        super__Vector_base<CFeeRate,_std::allocator<CFeeRate>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)__x);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_TxDimensions>,_std::_Select1st<std::pair<const_uint256,_TxDimensions>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
      ::_M_erase((_Rb_tree<uint256,_std::pair<const_uint256,_TxDimensions>,_std::_Select1st<std::pair<const_uint256,_TxDimensions>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                  *)tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&all_transactions);
      if (all_parent_outputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(all_parent_outputs.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)all_parent_outputs.
                              super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)all_parent_outputs.
                              super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (all_spent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(all_spent_outpoints.
                        super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)all_spent_outpoints.
                              super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)all_spent_outpoints.
                              super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (all_unspent_outpoints.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(all_unspent_outpoints.
                        super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)all_unspent_outpoints.
                              super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)all_unspent_outpoints.
                              super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return;
    }
    miniminer_manual._0_8_ =
         CTxMemPool::GetEntry
                   (this_00,&((psVar31->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->hash);
    pcVar32 = "pool.GetEntry(tx->GetHash())";
    ppCVar21 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                         ((CTxMemPoolEntry **)&miniminer_manual,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                          ,0xb6,"test_method","pool.GetEntry(tx->GetHash())");
    pCVar4 = *ppCVar21;
    peVar3 = (psVar31->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar22 = GetVirtualTransactionSize((long)pCVar4->nTxWeight,pCVar4->sigOpCost,nBytesPerSigOp);
    miniminer_manual._0_4_ = (int)iVar22;
    miniminer_pool._0_8_ = pCVar4->m_modified_fee;
    miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_ = miniminer_pool._0_8_;
    iVar22 = GetVirtualTransactionSize((long)pCVar4->nTxWeight,pCVar4->sigOpCost,nBytesPerSigOp);
    CFeeRate::CFeeRate((CFeeRate *)
                       &miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header,
                       (CAmount *)&miniminer_pool,(uint32_t)iVar22);
    p_Var23 = (_Rb_tree_node_base *)operator_new(0x58);
    __s1 = p_Var23 + 1;
    uVar6 = *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    p_Var10 = *(_Base_ptr *)
               ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    p_Var11 = *(_Base_ptr *)
               ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    p_Var23[1]._M_left =
         *(_Base_ptr *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
    ;
    p_Var23[1]._M_right = p_Var11;
    *(undefined8 *)(p_Var23 + 1) = uVar6;
    p_Var23[1]._M_parent = p_Var10;
    p_Var23[2]._M_left =
         (_Base_ptr)
         miniminer_manual.m_to_be_replaced._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    *(undefined8 *)(p_Var23 + 2) = miniminer_manual._0_8_;
    p_Var23[2]._M_parent = (_Base_ptr)miniminer_manual.m_to_be_replaced._M_t._M_impl._0_8_;
    p_Var5 = tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var36 = &p_Var1->_M_header;
    if (tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0044b544:
      if (p_Var36 != tx_dims._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
        p_Var24 = (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var36);
        goto LAB_0044b559;
      }
LAB_0044b56e:
      if (p_Var1 == (_Rb_tree_header *)p_Var36) {
        bVar16 = true;
      }
      else {
        iVar18 = memcmp(__s1,p_Var36 + 1,0x20);
        bVar16 = SUB41((uint)iVar18 >> 0x1f,0);
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar16,p_Var23,(_Rb_tree_node_base *)p_Var36,(_Rb_tree_node_base *)p_Var1);
      tx_dims._M_t._M_impl.super__Rb_tree_header._M_node_count =
           tx_dims._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    else {
      do {
        p_Var24 = p_Var5;
        uVar17 = memcmp(__s1,p_Var24 + 1,0x20);
        p_Var5 = (&p_Var24->_M_left)[~uVar17 >> 0x1f];
      } while ((&p_Var24->_M_left)[~uVar17 >> 0x1f] != (_Base_ptr)0x0);
      p_Var36 = p_Var24;
      if ((int)uVar17 < 0) goto LAB_0044b544;
LAB_0044b559:
      iVar18 = memcmp(p_Var24 + 1,__s1,0x20);
      if (iVar18 < 0) goto LAB_0044b56e;
      operator_delete(p_Var23,0x58);
    }
    psVar31 = psVar31 + 1;
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_1p1c, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create a parent tx0 and child tx1 with normal fees:
    const auto tx0 = make_tx({COutPoint{m_coinbase_txns[0]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx0));
    const auto tx1 = make_tx({COutPoint{tx0->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx1));

    // Create a low-feerate parent tx2 and high-feerate child tx3 (cpfp)
    const auto tx2 = make_tx({COutPoint{m_coinbase_txns[1]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx2));
    const auto tx3 = make_tx({COutPoint{tx2->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx3));

    // Create a parent tx4 and child tx5 where both have low fees
    const auto tx4 = make_tx({COutPoint{m_coinbase_txns[2]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx4));
    const auto tx5 = make_tx({COutPoint{tx4->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const CAmount tx5_delta{CENT/100};
    // Make tx5's modified fee much higher than its base fee. This should cause it to pass
    // the fee-related checks despite being low-feerate.
    pool.PrioritiseTransaction(tx5->GetHash(), tx5_delta);
    const CAmount tx5_mod_fee{low_fee + tx5_delta};

    // Create a high-feerate parent tx6, low-feerate child tx7
    const auto tx6 = make_tx({COutPoint{m_coinbase_txns[3]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx6));
    const auto tx7 = make_tx({COutPoint{tx6->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx7));

    std::vector<COutPoint> all_unspent_outpoints({
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx1->GetHash(), 0},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx3->GetHash(), 0},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx5->GetHash(), 0},
        COutPoint{tx6->GetHash(), 1},
        COutPoint{tx7->GetHash(), 0}
    });
    for (const auto& outpoint : all_unspent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));

    std::vector<COutPoint> all_spent_outpoints({
        COutPoint{tx0->GetHash(), 0},
        COutPoint{tx2->GetHash(), 0},
        COutPoint{tx4->GetHash(), 0},
        COutPoint{tx6->GetHash(), 0}
    });
    for (const auto& outpoint : all_spent_outpoints) BOOST_CHECK(pool.GetConflictTx(outpoint) != nullptr);

    std::vector<COutPoint> all_parent_outputs({
        COutPoint{tx0->GetHash(), 0},
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx2->GetHash(), 0},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx4->GetHash(), 0},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx6->GetHash(), 0},
        COutPoint{tx6->GetHash(), 1}
    });


    std::vector<CTransactionRef> all_transactions{tx0, tx1, tx2, tx3, tx4, tx5, tx6, tx7};
    struct TxDimensions {
        int32_t vsize; CAmount mod_fee; CFeeRate feerate;
    };
    std::map<uint256, TxDimensions> tx_dims;
    for (const auto& tx : all_transactions) {
        const auto& entry{*Assert(pool.GetEntry(tx->GetHash()))};
        tx_dims.emplace(tx->GetHash(), TxDimensions{entry.GetTxSize(), entry.GetModifiedFee(),
                                              CFeeRate(entry.GetModifiedFee(), entry.GetTxSize())});
    }

    const std::vector<CFeeRate> various_normal_feerates({CFeeRate(0), CFeeRate(500), CFeeRate(999),
                                                         CFeeRate(1000), CFeeRate(2000), CFeeRate(2500),
                                                         CFeeRate(3333), CFeeRate(7800), CFeeRate(11199),
                                                         CFeeRate(23330), CFeeRate(50000), CFeeRate(5*CENT)});

    // All nonexistent entries have a bumpfee of zero, regardless of feerate
    std::vector<COutPoint> nonexistent_outpoints({ COutPoint{Txid::FromUint256(GetRandHash()), 0}, COutPoint{Txid::FromUint256(GetRandHash()), 3} });
    for (const auto& outpoint : nonexistent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));
    for (const auto& feerate : various_normal_feerates) {
        node::MiniMiner mini_miner(pool, nonexistent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(feerate);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        BOOST_CHECK(bump_fees.size() == nonexistent_outpoints.size());
        for (const auto& outpoint: nonexistent_outpoints) {
            auto it = bump_fees.find(outpoint);
            BOOST_CHECK(it != bump_fees.end());
            BOOST_CHECK_EQUAL(it->second, 0);
        }
    }

    // Gather bump fees for all available UTXOs.
    for (const auto& target_feerate : various_normal_feerates) {
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());

        // Check tx0 bumpfee: no other bumper.
        const TxDimensions& tx0_dimensions = tx_dims.find(tx0->GetHash())->second;
        CAmount bumpfee0 = Find(bump_fees, COutPoint{tx0->GetHash(), 1});
        if (target_feerate <= tx0_dimensions.feerate) {
            BOOST_CHECK_EQUAL(bumpfee0, 0);
        } else {
            // Difference is fee to bump tx0 from current to target feerate.
            BOOST_CHECK_EQUAL(bumpfee0, target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee);
        }

        // Check tx2 bumpfee: assisted by tx3.
        const TxDimensions& tx2_dimensions = tx_dims.find(tx2->GetHash())->second;
        const TxDimensions& tx3_dimensions = tx_dims.find(tx3->GetHash())->second;
        const CFeeRate tx2_feerate = CFeeRate(tx2_dimensions.mod_fee + tx3_dimensions.mod_fee, tx2_dimensions.vsize + tx3_dimensions.vsize);
        CAmount bumpfee2 = Find(bump_fees, COutPoint{tx2->GetHash(), 1});
        if (target_feerate <= tx2_feerate) {
            // As long as target feerate is below tx3's ancestor feerate, there is no bump fee.
            BOOST_CHECK_EQUAL(bumpfee2, 0);
        } else {
            // Difference is fee to bump tx2 from current to target feerate, without tx3.
            BOOST_CHECK_EQUAL(bumpfee2, target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee);
        }

        // If tx5’s modified fees are sufficient for tx4 and tx5 to be picked
        // into the block, our prospective new transaction would not need to
        // bump tx4 when using tx4’s second output. If however even tx5’s
        // modified fee (which essentially indicates "effective feerate") is
        // not sufficient to bump tx4, using the second output of tx4 would
        // require our transaction to bump tx4 from scratch since we evaluate
        // transaction packages per ancestor sets and do not consider multiple
        // children’s fees.
        const TxDimensions& tx4_dimensions = tx_dims.find(tx4->GetHash())->second;
        const TxDimensions& tx5_dimensions = tx_dims.find(tx5->GetHash())->second;
        const CFeeRate tx4_feerate = CFeeRate(tx4_dimensions.mod_fee + tx5_dimensions.mod_fee, tx4_dimensions.vsize + tx5_dimensions.vsize);
        CAmount bumpfee4 = Find(bump_fees, COutPoint{tx4->GetHash(), 1});
        if (target_feerate <= tx4_feerate) {
            // As long as target feerate is below tx5's ancestor feerate, there is no bump fee.
            BOOST_CHECK_EQUAL(bumpfee4, 0);
        } else {
            // Difference is fee to bump tx4 from current to target feerate, without tx5.
            BOOST_CHECK_EQUAL(bumpfee4, target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee);
        }
    }
    // Spent outpoints should usually not be requested as they would not be
    // considered available. However, when they are explicitly requested, we
    // can calculate their bumpfee to facilitate RBF-replacements
    for (const auto& target_feerate : various_normal_feerates) {
        node::MiniMiner mini_miner_all_spent(pool, all_spent_outpoints);
        BOOST_CHECK(mini_miner_all_spent.IsReadyToCalculate());
        auto bump_fees_all_spent = mini_miner_all_spent.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner_all_spent.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees_all_spent.size(), all_spent_outpoints.size());
        node::MiniMiner mini_miner_all_parents(pool, all_parent_outputs);
        BOOST_CHECK(mini_miner_all_parents.IsReadyToCalculate());
        auto bump_fees_all_parents = mini_miner_all_parents.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner_all_parents.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees_all_parents.size(), all_parent_outputs.size());
        for (auto& bump_fees : {bump_fees_all_parents, bump_fees_all_spent}) {
            // For all_parents case, both outputs from the parent should have the same bump fee,
            // even though only one of them is in a to-be-replaced transaction.
            BOOST_CHECK(sanity_check(all_transactions, bump_fees));

            // Check tx0 bumpfee: no other bumper.
            const TxDimensions& tx0_dimensions = tx_dims.find(tx0->GetHash())->second;
            CAmount it0_spent = Find(bump_fees, COutPoint{tx0->GetHash(), 0});
            if (target_feerate <= tx0_dimensions.feerate) {
                BOOST_CHECK_EQUAL(it0_spent, 0);
            } else {
                // Difference is fee to bump tx0 from current to target feerate.
                BOOST_CHECK_EQUAL(it0_spent, target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee);
            }

            // Check tx2 bumpfee: no other bumper, because tx3 is to-be-replaced.
            const TxDimensions& tx2_dimensions = tx_dims.find(tx2->GetHash())->second;
            const CFeeRate tx2_feerate_unbumped = tx2_dimensions.feerate;
            auto it2_spent = Find(bump_fees, COutPoint{tx2->GetHash(), 0});
            if (target_feerate <= tx2_feerate_unbumped) {
                BOOST_CHECK_EQUAL(it2_spent, 0);
            } else {
                // Difference is fee to bump tx2 from current to target feerate, without tx3.
                BOOST_CHECK_EQUAL(it2_spent, target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee);
            }

            // Check tx4 bumpfee: no other bumper, because tx5 is to-be-replaced.
            const TxDimensions& tx4_dimensions = tx_dims.find(tx4->GetHash())->second;
            const CFeeRate tx4_feerate_unbumped = tx4_dimensions.feerate;
            auto it4_spent = Find(bump_fees, COutPoint{tx4->GetHash(), 0});
            if (target_feerate <= tx4_feerate_unbumped) {
                BOOST_CHECK_EQUAL(it4_spent, 0);
            } else {
                // Difference is fee to bump tx4 from current to target feerate, without tx5.
                BOOST_CHECK_EQUAL(it4_spent, target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee);
            }
        }
    }

    // Check m_inclusion_order for equivalent mempool- and manually-constructed MiniMiners.
    // (We cannot check bump fees in manually-constructed MiniMiners because it doesn't know what
    // outpoints are requested).
    std::vector<node::MiniMinerMempoolEntry> miniminer_info;
    {
        const int32_t tx0_vsize{tx_dims.at(tx0->GetHash()).vsize};
        const int32_t tx1_vsize{tx_dims.at(tx1->GetHash()).vsize};
        const int32_t tx2_vsize{tx_dims.at(tx2->GetHash()).vsize};
        const int32_t tx3_vsize{tx_dims.at(tx3->GetHash()).vsize};
        const int32_t tx4_vsize{tx_dims.at(tx4->GetHash()).vsize};
        const int32_t tx5_vsize{tx_dims.at(tx5->GetHash()).vsize};
        const int32_t tx6_vsize{tx_dims.at(tx6->GetHash()).vsize};
        const int32_t tx7_vsize{tx_dims.at(tx7->GetHash()).vsize};

        miniminer_info.emplace_back(tx0,/*vsize_self=*/tx0_vsize,/*vsize_ancestor=*/tx0_vsize,/*fee_self=*/med_fee,/*fee_ancestor=*/med_fee);
        miniminer_info.emplace_back(tx1,               tx1_vsize,       tx0_vsize + tx1_vsize,             med_fee,               2*med_fee);
        miniminer_info.emplace_back(tx2,               tx2_vsize,                   tx2_vsize,             low_fee,                 low_fee);
        miniminer_info.emplace_back(tx3,               tx3_vsize,       tx2_vsize + tx3_vsize,            high_fee,      low_fee + high_fee);
        miniminer_info.emplace_back(tx4,               tx4_vsize,                   tx4_vsize,             low_fee,                 low_fee);
        miniminer_info.emplace_back(tx5,               tx5_vsize,       tx4_vsize + tx5_vsize,         tx5_mod_fee,   low_fee + tx5_mod_fee);
        miniminer_info.emplace_back(tx6,               tx6_vsize,                   tx6_vsize,            high_fee,                high_fee);
        miniminer_info.emplace_back(tx7,               tx7_vsize,       tx6_vsize + tx7_vsize,             low_fee,      high_fee + low_fee);
    }
    std::map<Txid, std::set<Txid>> descendant_caches;
    descendant_caches.emplace(tx0->GetHash(), std::set<Txid>{tx0->GetHash(), tx1->GetHash()});
    descendant_caches.emplace(tx1->GetHash(), std::set<Txid>{tx1->GetHash()});
    descendant_caches.emplace(tx2->GetHash(), std::set<Txid>{tx2->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx3->GetHash(), std::set<Txid>{tx3->GetHash()});
    descendant_caches.emplace(tx4->GetHash(), std::set<Txid>{tx4->GetHash(), tx5->GetHash()});
    descendant_caches.emplace(tx5->GetHash(), std::set<Txid>{tx5->GetHash()});
    descendant_caches.emplace(tx6->GetHash(), std::set<Txid>{tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx7->GetHash(), std::set<Txid>{tx7->GetHash()});

    node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
    // Use unspent outpoints to avoid entries being omitted.
    node::MiniMiner miniminer_pool(pool, all_unspent_outpoints);
    BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
    BOOST_CHECK(miniminer_pool.IsReadyToCalculate());
    for (const auto& sequences : {miniminer_manual.Linearize(), miniminer_pool.Linearize()}) {
        // tx6 is selected first: high feerate with no parents to bump
        BOOST_CHECK_EQUAL(Find(sequences, tx6->GetHash()), 0);

        // tx2 + tx3 CPFP are selected next
        BOOST_CHECK_EQUAL(Find(sequences, tx2->GetHash()), 1);
        BOOST_CHECK_EQUAL(Find(sequences, tx3->GetHash()), 1);

        // tx4 + prioritised tx5 CPFP
        BOOST_CHECK_EQUAL(Find(sequences, tx4->GetHash()), 2);
        BOOST_CHECK_EQUAL(Find(sequences, tx5->GetHash()), 2);

        BOOST_CHECK_EQUAL(Find(sequences, tx0->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx1->GetHash()), 3);


        // tx7 is selected last: low feerate with no children
        BOOST_CHECK_EQUAL(Find(sequences, tx7->GetHash()), 4);
    }
}